

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx2_popcnt(uint16_t *data,uint32_t len,uint32_t *flags)

{
  long lVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 (*pauVar101) [32];
  uint uVar102;
  long lVar103;
  ulong uVar104;
  long lVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  __m256i masks [16];
  uint32_t out_counters [16];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [256];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_340 [12] [64];
  
  auVar147 = ZEXT1664((undefined1  [16])0x0);
  pauVar101 = &local_600;
  lVar103 = 0;
  local_700._0_64_ = vmovdqa64_avx512f(auVar147);
  local_740 = vmovdqa64_avx512f(auVar147);
  local_780 = vmovdqa64_avx512f(auVar147);
  local_7c0 = vmovdqa64_avx512f(auVar147);
  local_800 = vmovdqa64_avx512f(auVar147);
  local_840 = vmovdqa64_avx512f(auVar147);
  local_880 = vmovdqa64_avx512f(auVar147);
  local_8c0 = vmovdqa64_avx512f(auVar147);
  do {
    lVar103 = lVar103 + 1;
    auVar107 = vpbroadcastw_avx512vl();
    *pauVar101 = auVar107;
    pauVar101 = pauVar101 + 1;
  } while (lVar103 != 0x10);
  uVar102 = 0;
  local_340[0] = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  if (0xff < len) {
    auVar108 = vmovdqa64_avx512vl(local_480);
    lVar103 = 0;
    uVar104 = 0;
    auVar107._8_4_ = 0xfffcfffc;
    auVar107._0_8_ = 0xfffcfffcfffcfffc;
    auVar107._12_4_ = 0xfffcfffc;
    auVar107._16_4_ = 0xfffcfffc;
    auVar107._20_4_ = 0xfffcfffc;
    auVar107._24_4_ = 0xfffcfffc;
    auVar107._28_4_ = 0xfffcfffc;
    auVar109 = vandpd_avx512vl(local_5c0,auVar107);
    auVar110._8_4_ = 0xfff8fff8;
    auVar110._0_8_ = 0xfff8fff8fff8fff8;
    auVar110._12_4_ = 0xfff8fff8;
    auVar110._16_4_ = 0xfff8fff8;
    auVar110._20_4_ = 0xfff8fff8;
    auVar110._24_4_ = 0xfff8fff8;
    auVar110._28_4_ = 0xfff8fff8;
    auVar110 = vpandq_avx512vl(local_5a0,auVar110);
    auVar107 = vmovdqa64_avx512vl(auVar108);
    auVar111._8_4_ = 0xfff0fff0;
    auVar111._0_8_ = 0xfff0fff0fff0fff0;
    auVar111._12_4_ = 0xfff0fff0;
    auVar111._16_4_ = 0xfff0fff0;
    auVar111._20_4_ = 0xfff0fff0;
    auVar111._24_4_ = 0xfff0fff0;
    auVar111._28_4_ = 0xfff0fff0;
    auVar111 = vpandq_avx512vl(local_580,auVar111);
    auVar112._8_4_ = 0xffe0ffe0;
    auVar112._0_8_ = 0xffe0ffe0ffe0ffe0;
    auVar112._12_4_ = 0xffe0ffe0;
    auVar112._16_4_ = 0xffe0ffe0;
    auVar112._20_4_ = 0xffe0ffe0;
    auVar112._24_4_ = 0xffe0ffe0;
    auVar112._28_4_ = 0xffe0ffe0;
    auVar112 = vpandq_avx512vl(local_560,auVar112);
    auVar113._8_4_ = 0xfffefffe;
    auVar113._0_8_ = 0xfffefffefffefffe;
    auVar113._12_4_ = 0xfffefffe;
    auVar113._16_4_ = 0xfffefffe;
    auVar113._20_4_ = 0xfffefffe;
    auVar113._24_4_ = 0xfffefffe;
    auVar113._28_4_ = 0xfffefffe;
    auVar113 = vpandq_avx512vl(local_5e0,auVar113);
    auVar114._8_4_ = 0xff00ff00;
    auVar114._0_8_ = 0xff00ff00ff00ff00;
    auVar114._12_4_ = 0xff00ff00;
    auVar114._16_4_ = 0xff00ff00;
    auVar114._20_4_ = 0xff00ff00;
    auVar114._24_4_ = 0xff00ff00;
    auVar114._28_4_ = 0xff00ff00;
    auVar114 = vpandd_avx512vl(local_500,auVar114);
    auVar115._8_4_ = 0xfe00fe00;
    auVar115._0_8_ = 0xfe00fe00fe00fe00;
    auVar115._12_4_ = 0xfe00fe00;
    auVar115._16_4_ = 0xfe00fe00;
    auVar115._20_4_ = 0xfe00fe00;
    auVar115._24_4_ = 0xfe00fe00;
    auVar115._28_4_ = 0xfe00fe00;
    auVar115 = vpandq_avx512vl(local_4e0,auVar115);
    auVar116._8_4_ = 0xfc00fc00;
    auVar116._0_8_ = 0xfc00fc00fc00fc00;
    auVar116._12_4_ = 0xfc00fc00;
    auVar116._16_4_ = 0xfc00fc00;
    auVar116._20_4_ = 0xfc00fc00;
    auVar116._24_4_ = 0xfc00fc00;
    auVar116._28_4_ = 0xfc00fc00;
    auVar116 = vpandq_avx512vl(local_4c0,auVar116);
    do {
      auVar117 = vmovdqa64_avx512vl(local_5e0);
      auVar118 = vmovdqa64_avx512vl(local_520);
      auVar143 = vmovdqa64_avx512vl(auVar118);
      auVar63._8_8_ = uStack_438;
      auVar63._0_8_ = local_440;
      auVar63._16_8_ = uStack_430;
      auVar63._24_8_ = uStack_428;
      auVar119 = vmovdqa64_avx512vl(auVar63);
      auVar73._8_8_ = local_600._8_8_;
      auVar73._0_8_ = local_600._0_8_;
      auVar73._16_8_ = local_600._16_8_;
      auVar73._24_8_ = local_600._24_8_;
      auVar120 = vmovdqa64_avx512vl(auVar73);
      auVar166 = *(undefined1 (*) [32])(data + lVar103 * 0x10);
      auVar121 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(data + lVar103 * 0x10 + 0x10));
      auVar122 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(data + lVar103 * 0x10 + 0x20));
      auVar123 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(data + lVar103 * 0x10 + 0x30));
      auVar124 = vpandq_avx512vl(auVar117,auVar166);
      auVar125 = vpandq_avx512vl(auVar121,local_540);
      auVar126 = vpandq_avx512vl(auVar122,local_540);
      auVar127 = vpandq_avx512vl(auVar108,auVar166);
      auVar128 = vpandq_avx512vl(auVar120,auVar166);
      auVar129 = vpsrlw_avx512vl(auVar124,1);
      auVar124 = vpand_avx2(local_5c0,auVar166);
      auVar130 = vpsrlw_avx512vl(auVar125,5);
      auVar131 = vpsrlw_avx512vl(auVar126,4);
      auVar125._8_4_ = 0x7fe07fe;
      auVar125._0_8_ = 0x7fe07fe07fe07fe;
      auVar125._12_4_ = 0x7fe07fe;
      auVar125._16_4_ = 0x7fe07fe;
      auVar125._20_4_ = 0x7fe07fe;
      auVar125._24_4_ = 0x7fe07fe;
      auVar125._28_4_ = 0x7fe07fe;
      auVar130 = vpandq_avx512vl(auVar130,auVar125);
      auVar126._8_4_ = 0xffc0ffc;
      auVar126._0_8_ = 0xffc0ffc0ffc0ffc;
      auVar126._12_4_ = 0xffc0ffc;
      auVar126._16_4_ = 0xffc0ffc;
      auVar126._20_4_ = 0xffc0ffc;
      auVar126._24_4_ = 0xffc0ffc;
      auVar126._28_4_ = 0xffc0ffc;
      auVar131 = vpandq_avx512vl(auVar131,auVar126);
      auVar125 = vpsrlw_avx2(auVar127,0xc);
      auVar125 = vpor_avx2(auVar125,local_740._0_32_);
      auVar161 = vpsrlw_avx2(auVar124,2);
      auVar124 = vpand_avx2(local_5a0,auVar166);
      auVar162 = vpsrlw_avx2(auVar124,3);
      auVar124 = vpand_avx2(auVar166,local_580);
      auVar163 = vpsrlw_avx2(auVar124,4);
      auVar124 = vpand_avx2(auVar166,local_540);
      auVar124 = vpsrlw_avx2(auVar124,6);
      auVar132 = vporq_avx512vl(auVar124,local_800._0_32_);
      auVar124 = vpand_avx2(auVar166,local_520);
      auVar68._8_8_ = uStack_458;
      auVar68._0_8_ = local_460;
      auVar68._16_8_ = uStack_450;
      auVar68._24_8_ = uStack_448;
      auVar124 = vpsrlw_avx2(auVar124,7);
      auVar133 = vporq_avx512vl(auVar124,local_800._32_32_);
      auVar124 = vpand_avx2(auVar166,local_500);
      auVar124 = vpsrlw_avx2(auVar124,8);
      auVar134 = vporq_avx512vl(auVar124,local_7c0._0_32_);
      auVar124 = vpand_avx2(auVar166,local_4e0);
      auVar124 = vpsrlw_avx2(auVar124,9);
      auVar135 = vporq_avx512vl(auVar124,local_7c0._32_32_);
      auVar124 = vpand_avx2(auVar166,local_4c0);
      auVar124 = vpsrlw_avx2(auVar124,10);
      auVar126 = vpor_avx2(auVar124,local_780._0_32_);
      auVar124 = vpand_avx2(auVar166,local_4a0);
      auVar124 = vpsrlw_avx2(auVar124,0xb);
      auVar127 = vpor_avx2(auVar124,local_780._32_32_);
      auVar136 = vpternlogq_avx512vl(auVar131,auVar130,auVar132,0xfe);
      auVar130 = vpandq_avx512vl(auVar121,auVar118);
      auVar118 = vpandq_avx512vl(auVar122,auVar118);
      auVar124 = vpand_avx2(auVar166,auVar68);
      auVar130 = vpsrlw_avx512vl(auVar130,6);
      auVar131 = vpsrlw_avx512vl(auVar118,5);
      auVar118._8_4_ = 0x3fe03fe;
      auVar118._0_8_ = 0x3fe03fe03fe03fe;
      auVar118._12_4_ = 0x3fe03fe;
      auVar118._16_4_ = 0x3fe03fe;
      auVar118._20_4_ = 0x3fe03fe;
      auVar118._24_4_ = 0x3fe03fe;
      auVar118._28_4_ = 0x3fe03fe;
      auVar132 = vpandq_avx512vl(auVar130,auVar118);
      auVar130._8_4_ = 0x7fc07fc;
      auVar130._0_8_ = 0x7fc07fc07fc07fc;
      auVar130._12_4_ = 0x7fc07fc;
      auVar130._16_4_ = 0x7fc07fc;
      auVar130._20_4_ = 0x7fc07fc;
      auVar130._24_4_ = 0x7fc07fc;
      auVar130._28_4_ = 0x7fc07fc;
      auVar130 = vpandq_avx512vl(auVar131,auVar130);
      auVar124 = vpsrlw_avx2(auVar124,0xd);
      auVar124 = vpor_avx2(auVar124,local_740._32_32_);
      auVar118 = vpandq_avx512vl(auVar119,auVar166);
      auVar118 = vpsrlw_avx2(auVar118,0xe);
      auVar118 = vpor_avx2(auVar118,local_700._0_32_);
      auVar130 = vpternlogq_avx512vl(auVar130,auVar132,auVar133,0xfe);
      auVar131 = vpandq_avx512vl(auVar121,local_500);
      auVar132 = vpandq_avx512vl(auVar122,local_500);
      auVar97._8_8_ = uStack_418;
      auVar97._0_8_ = local_420;
      auVar97._16_8_ = uStack_410;
      auVar97._24_8_ = uStack_408;
      auVar133 = vpsrlw_avx512vl(auVar131,7);
      auVar137 = vpsrlw_avx512vl(auVar132,6);
      auVar131._8_4_ = 0x1fe01fe;
      auVar131._0_8_ = 0x1fe01fe01fe01fe;
      auVar131._12_4_ = 0x1fe01fe;
      auVar131._16_4_ = 0x1fe01fe;
      auVar131._20_4_ = 0x1fe01fe;
      auVar131._24_4_ = 0x1fe01fe;
      auVar131._28_4_ = 0x1fe01fe;
      auVar131 = vpandq_avx512vl(auVar133,auVar131);
      auVar132._8_4_ = 0x3fc03fc;
      auVar132._0_8_ = 0x3fc03fc03fc03fc;
      auVar132._12_4_ = 0x3fc03fc;
      auVar132._16_4_ = 0x3fc03fc;
      auVar132._20_4_ = 0x3fc03fc;
      auVar132._24_4_ = 0x3fc03fc;
      auVar132._28_4_ = 0x3fc03fc;
      auVar132 = vpandq_avx512vl(auVar137,auVar132);
      auVar131 = vpternlogq_avx512vl(auVar132,auVar131,auVar134,0xfe);
      auVar132 = vpandq_avx512vl(auVar121,local_4e0);
      auVar132 = vpsrlw_avx512vl(auVar132,8);
      auVar133._8_4_ = 0xfe00fe;
      auVar133._0_8_ = 0xfe00fe00fe00fe;
      auVar133._12_4_ = 0xfe00fe;
      auVar133._16_4_ = 0xfe00fe;
      auVar133._20_4_ = 0xfe00fe;
      auVar133._24_4_ = 0xfe00fe;
      auVar133._28_4_ = 0xfe00fe;
      auVar132 = vpandq_avx512vl(auVar132,auVar133);
      auVar133 = vpandq_avx512vl(auVar122,local_4e0);
      auVar133 = vpsrlw_avx512vl(auVar133,7);
      auVar134._8_4_ = 0x1fc01fc;
      auVar134._0_8_ = 0x1fc01fc01fc01fc;
      auVar134._12_4_ = 0x1fc01fc;
      auVar134._16_4_ = 0x1fc01fc;
      auVar134._20_4_ = 0x1fc01fc;
      auVar134._24_4_ = 0x1fc01fc;
      auVar134._28_4_ = 0x1fc01fc;
      auVar133 = vpandq_avx512vl(auVar133,auVar134);
      auVar132 = vpternlogq_avx512vl(auVar133,auVar132,auVar135,0xfe);
      auVar133 = vpandq_avx512vl(auVar121,local_4c0);
      auVar133 = vpsrlw_avx512vl(auVar133,9);
      auVar135._8_4_ = 0x7e007e;
      auVar135._0_8_ = 0x7e007e007e007e;
      auVar135._12_4_ = 0x7e007e;
      auVar135._16_4_ = 0x7e007e;
      auVar135._20_4_ = 0x7e007e;
      auVar135._24_4_ = 0x7e007e;
      auVar135._28_4_ = 0x7e007e;
      auVar133 = vpandq_avx512vl(auVar133,auVar135);
      auVar134 = vpandq_avx512vl(auVar122,local_4c0);
      auVar134 = vpsrlw_avx512vl(auVar134,8);
      auVar137._8_4_ = 0xfc00fc;
      auVar137._0_8_ = 0xfc00fc00fc00fc;
      auVar137._12_4_ = 0xfc00fc;
      auVar137._16_4_ = 0xfc00fc;
      auVar137._20_4_ = 0xfc00fc;
      auVar137._24_4_ = 0xfc00fc;
      auVar137._28_4_ = 0xfc00fc;
      auVar134 = vpandq_avx512vl(auVar134,auVar137);
      auVar126 = vpternlogq_avx512vl(auVar134,auVar133,auVar126,0xfe);
      auVar133 = vpandq_avx512vl(auVar121,local_4a0);
      auVar134 = vpandq_avx512vl(auVar122,local_4a0);
      auVar135 = vpsrlw_avx2(auVar133,10);
      auVar133 = vpsrlw_avx512vl(auVar134,9);
      auVar138._8_4_ = 0x3e003e;
      auVar138._0_8_ = 0x3e003e003e003e;
      auVar138._12_4_ = 0x3e003e;
      auVar138._16_4_ = 0x3e003e;
      auVar138._20_4_ = 0x3e003e;
      auVar138._24_4_ = 0x3e003e;
      auVar138._28_4_ = 0x3e003e;
      auVar134 = vpandq_avx512vl(auVar135,auVar138);
      auVar139._8_4_ = 0x7c007c;
      auVar139._0_8_ = 0x7c007c007c007c;
      auVar139._12_4_ = 0x7c007c;
      auVar139._16_4_ = 0x7c007c;
      auVar139._20_4_ = 0x7c007c;
      auVar139._24_4_ = 0x7c007c;
      auVar139._28_4_ = 0x7c007c;
      auVar133 = vpandq_avx512vl(auVar133,auVar139);
      auVar133 = vpternlogq_avx512vl(auVar133,auVar134,auVar127,0xfe);
      auVar127 = vpandq_avx512vl(auVar121,auVar108);
      auVar134 = vpandq_avx512vl(auVar122,auVar108);
      auVar135 = vpsrlw_avx2(auVar127,0xb);
      auVar134 = vpsrlw_avx2(auVar134,10);
      auVar127._8_4_ = 0x1e001e;
      auVar127._0_8_ = 0x1e001e001e001e;
      auVar127._12_4_ = 0x1e001e;
      auVar127._16_4_ = 0x1e001e;
      auVar127._20_4_ = 0x1e001e;
      auVar127._24_4_ = 0x1e001e;
      auVar127._28_4_ = 0x1e001e;
      auVar127 = vpandq_avx512vl(auVar135,auVar127);
      auVar140._8_4_ = 0x3c003c;
      auVar140._0_8_ = 0x3c003c003c003c;
      auVar140._12_4_ = 0x3c003c;
      auVar140._16_4_ = 0x3c003c;
      auVar140._20_4_ = 0x3c003c;
      auVar140._24_4_ = 0x3c003c;
      auVar140._28_4_ = 0x3c003c;
      auVar134 = vpandq_avx512vl(auVar134,auVar140);
      auVar127 = vpternlogq_avx512vl(auVar134,auVar127,auVar125,0xfe);
      auVar125 = vpandq_avx512vl(auVar121,auVar68);
      auVar134 = vpandq_avx512vl(auVar122,auVar68);
      auVar125 = vpsrlw_avx2(auVar125,0xc);
      auVar134 = vpsrlw_avx2(auVar134,0xb);
      auVar164._8_4_ = 0xe000e;
      auVar164._0_8_ = 0xe000e000e000e;
      auVar164._12_4_ = 0xe000e;
      auVar164._16_4_ = 0xe000e;
      auVar164._20_4_ = 0xe000e;
      auVar164._24_4_ = 0xe000e;
      auVar164._28_4_ = 0xe000e;
      auVar125 = vpandq_avx512vl(auVar125,auVar164);
      auVar170._8_4_ = 0x1c001c;
      auVar170._0_8_ = 0x1c001c001c001c;
      auVar170._12_4_ = 0x1c001c;
      auVar170._16_4_ = 0x1c001c;
      auVar170._20_4_ = 0x1c001c;
      auVar170._24_4_ = 0x1c001c;
      auVar170._28_4_ = 0x1c001c;
      auVar134 = vpandq_avx512vl(auVar134,auVar170);
      auVar134 = vpternlogq_avx512vl(auVar134,auVar125,auVar124,0xfe);
      auVar124 = vpandq_avx512vl(auVar121,auVar119);
      auVar125 = vpandq_avx512vl(auVar122,auVar119);
      auVar135 = vpsrlw_avx2(auVar124,0xd);
      auVar125 = vpsrlw_avx2(auVar125,0xc);
      auVar124._8_4_ = 0xc000c;
      auVar124._0_8_ = 0xc000c000c000c;
      auVar124._12_4_ = 0xc000c;
      auVar124._16_4_ = 0xc000c;
      auVar124._20_4_ = 0xc000c;
      auVar124._24_4_ = 0xc000c;
      auVar124._28_4_ = 0xc000c;
      auVar124 = vpandq_avx512vl(auVar125,auVar124);
      auVar119._8_4_ = 0x60006;
      auVar119._0_8_ = 0x6000600060006;
      auVar119._12_4_ = 0x60006;
      auVar119._16_4_ = 0x60006;
      auVar119._20_4_ = 0x60006;
      auVar119._24_4_ = 0x60006;
      auVar119._28_4_ = 0x60006;
      auVar125 = vpandq_avx512vl(auVar135,auVar119);
      auVar135 = vpandq_avx512vl(auVar121,local_5c0);
      auVar137 = vpandq_avx512vl(auVar121,local_5a0);
      auVar137 = vpsrlw_avx2(auVar137,2);
      auVar165._8_4_ = 0x3ffe3ffe;
      auVar165._0_8_ = 0x3ffe3ffe3ffe3ffe;
      auVar165._12_4_ = 0x3ffe3ffe;
      auVar165._16_4_ = 0x3ffe3ffe;
      auVar165._20_4_ = 0x3ffe3ffe;
      auVar165._24_4_ = 0x3ffe3ffe;
      auVar165._28_4_ = 0x3ffe3ffe;
      auVar137 = vpandq_avx512vl(auVar137,auVar165);
      auVar138 = vpandq_avx512vl(auVar121,local_580);
      auVar135 = vpsrlw_avx2(auVar135,1);
      auVar141._8_4_ = 0x7ffe7ffe;
      auVar141._0_8_ = 0x7ffe7ffe7ffe7ffe;
      auVar141._12_4_ = 0x7ffe7ffe;
      auVar141._16_4_ = 0x7ffe7ffe;
      auVar141._20_4_ = 0x7ffe7ffe;
      auVar141._24_4_ = 0x7ffe7ffe;
      auVar141._28_4_ = 0x7ffe7ffe;
      auVar135 = vpandq_avx512vl(auVar135,auVar141);
      auVar138 = vpsrlw_avx2(auVar138,3);
      auVar142._8_4_ = 0x1ffe1ffe;
      auVar142._0_8_ = 0x1ffe1ffe1ffe1ffe;
      auVar142._12_4_ = 0x1ffe1ffe;
      auVar142._16_4_ = 0x1ffe1ffe;
      auVar142._20_4_ = 0x1ffe1ffe;
      auVar142._24_4_ = 0x1ffe1ffe;
      auVar142._28_4_ = 0x1ffe1ffe;
      auVar138 = vpandq_avx512vl(auVar138,auVar142);
      auVar139 = vpandq_avx512vl(auVar121,local_560);
      auVar135 = vpternlogq_avx512vl(auVar135,auVar161,local_880._0_32_,0xfe);
      auVar170 = vpsrlw_avx2(auVar139,4);
      auVar118 = vpternlogq_avx512vl(auVar124,auVar125,auVar118,0xfe);
      auVar139 = vpandq_avx512vl(auVar121,auVar120);
      auVar124 = vpand_avx2(auVar166,local_560);
      auVar125 = vpand_avx2(auVar166,auVar97);
      auVar166 = vpaddw_avx2(auVar139,auVar139);
      auVar139 = vpternlogq_avx512vl(auVar166,auVar128,local_8c0._0_32_,0xfe);
      auVar140 = vpandq_avx512vl(auVar121,auVar113);
      auVar164 = vpsrlw_avx2(auVar124,5);
      auVar166 = vpsrlw_avx2(auVar125,0xf);
      auVar166 = vpor_avx2(auVar166,local_700._32_32_);
      auVar124 = vpternlogq_avx512vl(auVar140,auVar129,local_8c0._32_32_,0xfe);
      auVar128._8_4_ = 0xffe0ffe;
      auVar128._0_8_ = 0xffe0ffe0ffe0ffe;
      auVar128._12_4_ = 0xffe0ffe;
      auVar128._16_4_ = 0xffe0ffe;
      auVar128._20_4_ = 0xffe0ffe;
      auVar128._24_4_ = 0xffe0ffe;
      auVar128._28_4_ = 0xffe0ffe;
      auVar125 = vpandq_avx512vl(auVar170,auVar128);
      auVar140 = vpandq_avx512vl(auVar122,auVar97);
      auVar137 = vpternlogq_avx512vl(auVar137,auVar162,local_880._32_32_,0xfe);
      auVar125 = vpternlogq_avx512vl(auVar125,auVar164,local_840._32_32_,0xfe);
      auVar164 = vpandq_avx512vl(auVar121,auVar97);
      auVar140 = vpsrlw_avx2(auVar140,0xd);
      auVar121._8_4_ = 0x40004;
      auVar121._0_8_ = 0x4000400040004;
      auVar121._12_4_ = 0x40004;
      auVar121._16_4_ = 0x40004;
      auVar121._20_4_ = 0x40004;
      auVar121._24_4_ = 0x40004;
      auVar121._28_4_ = 0x40004;
      auVar140 = vpandq_avx512vl(auVar140,auVar121);
      auVar164 = vpsrlw_avx2(auVar164,0xe);
      auVar129._8_4_ = 0x20002;
      auVar129._0_8_ = 0x2000200020002;
      auVar129._12_4_ = 0x20002;
      auVar129._16_4_ = 0x20002;
      auVar129._20_4_ = 0x20002;
      auVar129._24_4_ = 0x20002;
      auVar129._28_4_ = 0x20002;
      auVar164 = vpandq_avx512vl(auVar164,auVar129);
      auVar138 = vpternlogq_avx512vl(auVar138,auVar163,local_840._0_32_,0xfe);
      auVar140 = vpternlogq_avx512vl(auVar140,auVar164,auVar166,0xfe);
      auVar166 = vpandq_avx512vl(auVar122,auVar120);
      auVar164 = vpandq_avx512vl(auVar123,auVar120);
      auVar170 = vpbroadcastq_avx512vl(ZEXT816(0xfff8fff8fff8fff8));
      auVar119 = vpsllw_avx2(auVar164,3);
      auVar164 = vpsllw_avx2(auVar166,2);
      auVar166 = vpandq_avx512vl(auVar123,auVar117);
      auVar139 = vpternlogq_avx512vl(auVar119,auVar139,auVar164,0xfe);
      auVar164 = vpandq_avx512vl(auVar122,auVar117);
      auVar119 = vpsllw_avx2(auVar166,2);
      auVar166 = vpaddw_avx2(auVar164,auVar164);
      auVar117._8_4_ = 0xfffcfffc;
      auVar117._0_8_ = 0xfffcfffcfffcfffc;
      auVar117._12_4_ = 0xfffcfffc;
      auVar117._16_4_ = 0xfffcfffc;
      auVar117._20_4_ = 0xfffcfffc;
      auVar117._24_4_ = 0xfffcfffc;
      auVar117._28_4_ = 0xfffcfffc;
      auVar166 = vpandq_avx512vl(auVar166,auVar117);
      auVar164 = vpandq_avx512vl(auVar119,auVar170);
      auVar164 = vpternlogq_avx512vl(auVar164,auVar166,auVar124,0xfe);
      auVar124 = vpandq_avx512vl(auVar122,auVar109);
      auVar166 = vpandq_avx512vl(auVar123,local_5c0);
      auVar166 = vpaddw_avx2(auVar166,auVar166);
      auVar166 = vpandq_avx512vl(auVar166,auVar170);
      auVar170 = vpandq_avx512vl(auVar123,auVar110);
      auVar119 = vpbroadcastq_avx512vl(ZEXT816(0xfff0fff0fff0fff0));
      auVar135 = vpternlogq_avx512vl(auVar166,auVar124,auVar135,0xfe);
      auVar166 = vpandq_avx512vl(auVar122,local_5a0);
      auVar124 = vpandq_avx512vl(auVar122,local_560);
      auVar165 = vpsrlw_avx2(auVar166,1);
      auVar166._8_4_ = 0x7ffc7ffc;
      auVar166._0_8_ = 0x7ffc7ffc7ffc7ffc;
      auVar166._12_4_ = 0x7ffc7ffc;
      auVar166._16_4_ = 0x7ffc7ffc;
      auVar166._20_4_ = 0x7ffc7ffc;
      auVar166._24_4_ = 0x7ffc7ffc;
      auVar166._28_4_ = 0x7ffc7ffc;
      auVar166 = vpandq_avx512vl(auVar165,auVar166);
      auVar124 = vpsrlw_avx2(auVar124,3);
      auVar137 = vpternlogq_avx512vl(auVar170,auVar166,auVar137,0xfe);
      auVar166 = vpandq_avx512vl(auVar122,local_580);
      auVar120._8_4_ = 0x1ffc1ffc;
      auVar120._0_8_ = 0x1ffc1ffc1ffc1ffc;
      auVar120._12_4_ = 0x1ffc1ffc;
      auVar120._16_4_ = 0x1ffc1ffc;
      auVar120._20_4_ = 0x1ffc1ffc;
      auVar120._24_4_ = 0x1ffc1ffc;
      auVar120._28_4_ = 0x1ffc1ffc;
      auVar124 = vpandq_avx512vl(auVar124,auVar120);
      auVar170 = vpandq_avx512vl(auVar123,local_580);
      auVar69._8_8_ = uStack_458;
      auVar69._0_8_ = local_460;
      auVar69._16_8_ = uStack_450;
      auVar69._24_8_ = uStack_448;
      auVar166 = vpsrlw_avx2(auVar166,2);
      auVar170 = vpsrlw_avx2(auVar170,1);
      auVar122._8_4_ = 0x3ffc3ffc;
      auVar122._0_8_ = 0x3ffc3ffc3ffc3ffc;
      auVar122._12_4_ = 0x3ffc3ffc;
      auVar122._16_4_ = 0x3ffc3ffc;
      auVar122._20_4_ = 0x3ffc3ffc;
      auVar122._24_4_ = 0x3ffc3ffc;
      auVar122._28_4_ = 0x3ffc3ffc;
      auVar166 = vpandq_avx512vl(auVar166,auVar122);
      auVar161._8_4_ = 0x7ff87ff8;
      auVar161._0_8_ = 0x7ff87ff87ff87ff8;
      auVar161._12_4_ = 0x7ff87ff8;
      auVar161._16_4_ = 0x7ff87ff8;
      auVar161._20_4_ = 0x7ff87ff8;
      auVar161._24_4_ = 0x7ff87ff8;
      auVar161._28_4_ = 0x7ff87ff8;
      auVar170 = vpandq_avx512vl(auVar170,auVar161);
      auVar138 = vpternlogq_avx512vl(auVar170,auVar166,auVar138,0xfe);
      auVar166 = vpandq_avx512vl(auVar123,local_560);
      auVar166 = vpsrlw_avx2(auVar166,2);
      auVar162._8_4_ = 0x3ff83ff8;
      auVar162._0_8_ = 0x3ff83ff83ff83ff8;
      auVar162._12_4_ = 0x3ff83ff8;
      auVar162._16_4_ = 0x3ff83ff8;
      auVar162._20_4_ = 0x3ff83ff8;
      auVar162._24_4_ = 0x3ff83ff8;
      auVar162._28_4_ = 0x3ff83ff8;
      auVar170 = vpandq_avx512vl(auVar166,auVar162);
      auVar166 = vpandq_avx512vl(auVar123,local_540);
      auVar166 = vpsrlw_avx2(auVar166,3);
      auVar163._8_4_ = 0x1ff81ff8;
      auVar163._0_8_ = 0x1ff81ff81ff81ff8;
      auVar163._12_4_ = 0x1ff81ff8;
      auVar163._16_4_ = 0x1ff81ff8;
      auVar163._20_4_ = 0x1ff81ff8;
      auVar163._24_4_ = 0x1ff81ff8;
      auVar163._28_4_ = 0x1ff81ff8;
      auVar165 = vpandq_avx512vl(auVar166,auVar163);
      auVar166 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0x40);
      auVar125 = vpternlogq_avx512vl(auVar170,auVar124,auVar125,0xfe);
      auVar124 = vpand_avx2(auVar166,local_540);
      auVar124 = vpsrlw_avx2(auVar124,2);
      auVar2._8_4_ = 0x3ff03ff0;
      auVar2._0_8_ = 0x3ff03ff03ff03ff0;
      auVar2._12_4_ = 0x3ff03ff0;
      auVar2._16_4_ = 0x3ff03ff0;
      auVar2._20_4_ = 0x3ff03ff0;
      auVar2._24_4_ = 0x3ff03ff0;
      auVar2._28_4_ = 0x3ff03ff0;
      auVar124 = vpandq_avx512vl(auVar124,auVar2);
      auVar170 = vpternlogq_avx512vl(auVar124,auVar165,auVar136,0xfe);
      auVar124 = vpandq_avx512vl(auVar123,auVar143);
      auVar124 = vpsrlw_avx512vl(auVar124,4);
      auVar136._8_4_ = 0xff80ff8;
      auVar136._0_8_ = 0xff80ff80ff80ff8;
      auVar136._12_4_ = 0xff80ff8;
      auVar136._16_4_ = 0xff80ff8;
      auVar136._20_4_ = 0xff80ff8;
      auVar136._24_4_ = 0xff80ff8;
      auVar136._28_4_ = 0xff80ff8;
      auVar124 = vpandq_avx512vl(auVar124,auVar136);
      auVar165 = vpandq_avx512vl(auVar166,auVar143);
      auVar165 = vpsrlw_avx512vl(auVar165,3);
      auVar3._8_4_ = 0x1ff01ff0;
      auVar3._0_8_ = 0x1ff01ff01ff01ff0;
      auVar3._12_4_ = 0x1ff01ff0;
      auVar3._16_4_ = 0x1ff01ff0;
      auVar3._20_4_ = 0x1ff01ff0;
      auVar3._24_4_ = 0x1ff01ff0;
      auVar3._28_4_ = 0x1ff01ff0;
      auVar165 = vpandq_avx512vl(auVar165,auVar3);
      auVar130 = vpternlogq_avx512vl(auVar165,auVar124,auVar130,0xfe);
      auVar124 = vpandq_avx512vl(auVar123,local_500);
      auVar124 = vpsrlw_avx512vl(auVar124,5);
      auVar4._8_4_ = 0x7f807f8;
      auVar4._0_8_ = 0x7f807f807f807f8;
      auVar4._12_4_ = 0x7f807f8;
      auVar4._16_4_ = 0x7f807f8;
      auVar4._20_4_ = 0x7f807f8;
      auVar4._24_4_ = 0x7f807f8;
      auVar4._28_4_ = 0x7f807f8;
      auVar124 = vpandq_avx512vl(auVar124,auVar4);
      auVar165 = vpandq_avx512vl(auVar166,local_500);
      auVar165 = vpsrlw_avx512vl(auVar165,4);
      auVar5._8_4_ = 0xff00ff0;
      auVar5._0_8_ = 0xff00ff00ff00ff0;
      auVar5._12_4_ = 0xff00ff0;
      auVar5._16_4_ = 0xff00ff0;
      auVar5._20_4_ = 0xff00ff0;
      auVar5._24_4_ = 0xff00ff0;
      auVar5._28_4_ = 0xff00ff0;
      auVar165 = vpandq_avx512vl(auVar165,auVar5);
      auVar131 = vpternlogq_avx512vl(auVar165,auVar124,auVar131,0xfe);
      auVar124 = vpandq_avx512vl(auVar123,local_4e0);
      auVar165 = vmovdqa64_avx512vl(auVar108);
      auVar124 = vpsrlw_avx512vl(auVar124,6);
      auVar6._8_4_ = 0x3f803f8;
      auVar6._0_8_ = 0x3f803f803f803f8;
      auVar6._12_4_ = 0x3f803f8;
      auVar6._16_4_ = 0x3f803f8;
      auVar6._20_4_ = 0x3f803f8;
      auVar6._24_4_ = 0x3f803f8;
      auVar6._28_4_ = 0x3f803f8;
      auVar124 = vpandq_avx512vl(auVar124,auVar6);
      auVar141 = vpandq_avx512vl(auVar166,local_4e0);
      auVar141 = vpsrlw_avx512vl(auVar141,5);
      auVar7._8_4_ = 0x7f007f0;
      auVar7._0_8_ = 0x7f007f007f007f0;
      auVar7._12_4_ = 0x7f007f0;
      auVar7._16_4_ = 0x7f007f0;
      auVar7._20_4_ = 0x7f007f0;
      auVar7._24_4_ = 0x7f007f0;
      auVar7._28_4_ = 0x7f007f0;
      auVar141 = vpandq_avx512vl(auVar141,auVar7);
      auVar132 = vpternlogq_avx512vl(auVar141,auVar124,auVar132,0xfe);
      auVar124 = vpandq_avx512vl(auVar123,local_4c0);
      auVar124 = vpsrlw_avx512vl(auVar124,7);
      auVar8._8_4_ = 0x1f801f8;
      auVar8._0_8_ = 0x1f801f801f801f8;
      auVar8._12_4_ = 0x1f801f8;
      auVar8._16_4_ = 0x1f801f8;
      auVar8._20_4_ = 0x1f801f8;
      auVar8._24_4_ = 0x1f801f8;
      auVar8._28_4_ = 0x1f801f8;
      auVar124 = vpandq_avx512vl(auVar124,auVar8);
      auVar141 = vpandq_avx512vl(auVar166,local_4c0);
      auVar141 = vpsrlw_avx512vl(auVar141,6);
      auVar9._8_4_ = 0x3f003f0;
      auVar9._0_8_ = 0x3f003f003f003f0;
      auVar9._12_4_ = 0x3f003f0;
      auVar9._16_4_ = 0x3f003f0;
      auVar9._20_4_ = 0x3f003f0;
      auVar9._24_4_ = 0x3f003f0;
      auVar9._28_4_ = 0x3f003f0;
      auVar141 = vpandq_avx512vl(auVar141,auVar9);
      auVar126 = vpternlogq_avx512vl(auVar141,auVar124,auVar126,0xfe);
      auVar124 = vpandq_avx512vl(auVar123,local_4a0);
      auVar124 = vpsrlw_avx512vl(auVar124,8);
      auVar10._8_4_ = 0xf800f8;
      auVar10._0_8_ = 0xf800f800f800f8;
      auVar10._12_4_ = 0xf800f8;
      auVar10._16_4_ = 0xf800f8;
      auVar10._20_4_ = 0xf800f8;
      auVar10._24_4_ = 0xf800f8;
      auVar10._28_4_ = 0xf800f8;
      auVar124 = vpandq_avx512vl(auVar124,auVar10);
      auVar141 = vpandq_avx512vl(auVar166,local_4a0);
      auVar141 = vpsrlw_avx512vl(auVar141,7);
      auVar11._8_4_ = 0x1f001f0;
      auVar11._0_8_ = 0x1f001f001f001f0;
      auVar11._12_4_ = 0x1f001f0;
      auVar11._16_4_ = 0x1f001f0;
      auVar11._20_4_ = 0x1f001f0;
      auVar11._24_4_ = 0x1f001f0;
      auVar11._28_4_ = 0x1f001f0;
      auVar141 = vpandq_avx512vl(auVar141,auVar11);
      auVar133 = vpternlogq_avx512vl(auVar141,auVar124,auVar133,0xfe);
      auVar124 = vpandq_avx512vl(auVar123,auVar108);
      auVar124 = vpsrlw_avx512vl(auVar124,9);
      auVar12._8_4_ = 0x780078;
      auVar12._0_8_ = 0x78007800780078;
      auVar12._12_4_ = 0x780078;
      auVar12._16_4_ = 0x780078;
      auVar12._20_4_ = 0x780078;
      auVar12._24_4_ = 0x780078;
      auVar12._28_4_ = 0x780078;
      auVar124 = vpandq_avx512vl(auVar124,auVar12);
      auVar108 = vpandq_avx512vl(auVar166,auVar108);
      auVar141 = vpbroadcastq_avx512vl(ZEXT816(0xffe0ffe0ffe0ffe0));
      auVar142 = vpsrlw_avx512vl(auVar108,8);
      auVar108._8_4_ = 0xf000f0;
      auVar108._0_8_ = 0xf000f000f000f0;
      auVar108._12_4_ = 0xf000f0;
      auVar108._16_4_ = 0xf000f0;
      auVar108._20_4_ = 0xf000f0;
      auVar108._24_4_ = 0xf000f0;
      auVar108._28_4_ = 0xf000f0;
      auVar108 = vpandq_avx512vl(auVar142,auVar108);
      auVar127 = vpternlogq_avx512vl(auVar108,auVar124,auVar127,0xfe);
      auVar108 = vpandq_avx512vl(auVar123,auVar69);
      auVar108 = vpsrlw_avx512vl(auVar108,10);
      auVar13._8_4_ = 0x380038;
      auVar13._0_8_ = 0x38003800380038;
      auVar13._12_4_ = 0x380038;
      auVar13._16_4_ = 0x380038;
      auVar13._20_4_ = 0x380038;
      auVar13._24_4_ = 0x380038;
      auVar13._28_4_ = 0x380038;
      auVar108 = vpandq_avx512vl(auVar108,auVar13);
      auVar124 = vpandq_avx512vl(auVar166,auVar69);
      auVar64._8_8_ = uStack_438;
      auVar64._0_8_ = local_440;
      auVar64._16_8_ = uStack_430;
      auVar64._24_8_ = uStack_428;
      auVar124 = vpsrlw_avx512vl(auVar124,9);
      auVar14._8_4_ = 0x700070;
      auVar14._0_8_ = 0x70007000700070;
      auVar14._12_4_ = 0x700070;
      auVar14._16_4_ = 0x700070;
      auVar14._20_4_ = 0x700070;
      auVar14._24_4_ = 0x700070;
      auVar14._28_4_ = 0x700070;
      auVar124 = vpandq_avx512vl(auVar124,auVar14);
      auVar134 = vpternlogq_avx512vl(auVar124,auVar108,auVar134,0xfe);
      auVar108 = vpandq_avx512vl(auVar123,auVar97);
      auVar124 = vpandq_avx512vl(auVar123,auVar64);
      auVar108 = vpsrlw_avx512vl(auVar108,0xc);
      auVar123._8_4_ = 0x80008;
      auVar123._0_8_ = 0x8000800080008;
      auVar123._12_4_ = 0x80008;
      auVar123._16_4_ = 0x80008;
      auVar123._20_4_ = 0x80008;
      auVar123._24_4_ = 0x80008;
      auVar123._28_4_ = 0x80008;
      auVar108 = vpandq_avx512vl(auVar108,auVar123);
      auVar142 = vpandq_avx512vl(auVar166,auVar64);
      auVar124 = vpsrlw_avx512vl(auVar124,0xb);
      auVar15._8_4_ = 0x180018;
      auVar15._0_8_ = 0x18001800180018;
      auVar15._12_4_ = 0x180018;
      auVar15._16_4_ = 0x180018;
      auVar15._20_4_ = 0x180018;
      auVar15._24_4_ = 0x180018;
      auVar15._28_4_ = 0x180018;
      auVar124 = vpandq_avx512vl(auVar124,auVar15);
      auVar74._8_8_ = local_600._8_8_;
      auVar74._0_8_ = local_600._0_8_;
      auVar74._16_8_ = local_600._16_8_;
      auVar74._24_8_ = local_600._24_8_;
      auVar142 = vpsrlw_avx512vl(auVar142,10);
      auVar16._8_4_ = 0x300030;
      auVar16._0_8_ = 0x30003000300030;
      auVar16._12_4_ = 0x300030;
      auVar16._16_4_ = 0x300030;
      auVar16._20_4_ = 0x300030;
      auVar16._24_4_ = 0x300030;
      auVar16._28_4_ = 0x300030;
      auVar142 = vpandq_avx512vl(auVar142,auVar16);
      auVar118 = vpternlogq_avx512vl(auVar142,auVar124,auVar118,0xfe);
      auVar124 = vpandq_avx512vl(auVar166,auVar74);
      auVar124 = vpsllw_avx512vl(auVar124,4);
      auVar142 = vpandq_avx512vl(auVar166,auVar97);
      auVar142 = vpsrlw_avx512vl(auVar142,0xb);
      auVar17._8_4_ = 0x100010;
      auVar17._0_8_ = 0x10001000100010;
      auVar17._12_4_ = 0x100010;
      auVar17._16_4_ = 0x100010;
      auVar17._20_4_ = 0x100010;
      auVar17._24_4_ = 0x100010;
      auVar17._28_4_ = 0x100010;
      auVar142 = vpandq_avx512vl(auVar142,auVar17);
      auVar128 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(data + lVar103 * 0x10 + 0x50));
      auVar140 = vpternlogq_avx512vl(auVar142,auVar108,auVar140,0xfe);
      auVar108 = vpandq_avx512vl(auVar128,auVar74);
      auVar142 = vpandq_avx512vl(auVar128,local_5e0);
      auVar108 = vpsllw_avx2(auVar108,5);
      auVar142 = vpsllw_avx512vl(auVar142,4);
      auVar139 = vpternlogq_avx512vl(auVar108,auVar139,auVar124,0xfe);
      auVar108 = vpand_avx2(auVar166,local_5e0);
      auVar124 = vpandq_avx512vl(auVar142,auVar141);
      auVar108 = vpsllw_avx2(auVar108,3);
      auVar108 = vpandq_avx512vl(auVar108,auVar119);
      auVar164 = vpternlogq_avx512vl(auVar124,auVar108,auVar164,0xfe);
      auVar108 = vpand_avx2(auVar166,local_5c0);
      auVar124 = vpandq_avx512vl(auVar128,local_5c0);
      auVar142 = vpsllw_avx2(auVar108,2);
      auVar108 = vpsllw_avx2(auVar124,3);
      auVar108 = vpandq_avx512vl(auVar108,auVar141);
      auVar124 = vpandq_avx512vl(auVar142,auVar119);
      auVar172._8_8_ = 0xffc0ffc0ffc0ffc0;
      auVar172._0_8_ = 0xffc0ffc0ffc0ffc0;
      auVar172._16_8_ = 0xffc0ffc0ffc0ffc0;
      auVar172._24_8_ = 0xffc0ffc0ffc0ffc0;
      auVar135 = vpternlogq_avx512vl(auVar108,auVar124,auVar135,0xfe);
      auVar108 = vpand_avx2(auVar166,local_5a0);
      auVar124 = vpandq_avx512vl(auVar128,local_5a0);
      auVar108 = vpaddw_avx2(auVar108,auVar108);
      auVar124 = vpsllw_avx2(auVar124,2);
      auVar108 = vpandq_avx512vl(auVar108,auVar119);
      auVar124 = vpandq_avx512vl(auVar124,auVar141);
      auVar119 = vmovdqa64_avx512vl(local_5a0);
      auVar137 = vpternlogq_avx512vl(auVar124,auVar108,auVar137,0xfe);
      auVar108 = vpandq_avx512vl(auVar128,local_580);
      auVar124 = vpand_avx2(auVar166,auVar111);
      auVar108 = vpaddw_avx2(auVar108,auVar108);
      auVar108 = vpandq_avx512vl(auVar108,auVar141);
      auVar141 = vmovdqa64_avx512vl(local_560);
      auVar138 = vpternlogq_avx512vl(auVar108,auVar124,auVar138,0xfe);
      auVar108 = vpandq_avx512vl(auVar128,auVar112);
      auVar70._8_8_ = uStack_458;
      auVar70._0_8_ = local_460;
      auVar70._16_8_ = uStack_450;
      auVar70._24_8_ = uStack_448;
      auVar166 = vpandq_avx512vl(auVar166,auVar141);
      auVar166 = vpsrlw_avx2(auVar166,1);
      auVar18._8_4_ = 0x7ff07ff0;
      auVar18._0_8_ = 0x7ff07ff07ff07ff0;
      auVar18._12_4_ = 0x7ff07ff0;
      auVar18._16_4_ = 0x7ff07ff0;
      auVar18._20_4_ = 0x7ff07ff0;
      auVar18._24_4_ = 0x7ff07ff0;
      auVar18._28_4_ = 0x7ff07ff0;
      auVar166 = vpandq_avx512vl(auVar166,auVar18);
      auVar125 = vpternlogq_avx512vl(auVar108,auVar166,auVar125,0xfe);
      auVar108 = vpandq_avx512vl(auVar128,local_540);
      auVar98._8_8_ = uStack_418;
      auVar98._0_8_ = local_420;
      auVar98._16_8_ = uStack_410;
      auVar98._24_8_ = uStack_408;
      auVar108 = vpsrlw_avx2(auVar108,1);
      auVar19._8_4_ = 0x7fe07fe0;
      auVar19._0_8_ = 0x7fe07fe07fe07fe0;
      auVar19._12_4_ = 0x7fe07fe0;
      auVar19._16_4_ = 0x7fe07fe0;
      auVar19._20_4_ = 0x7fe07fe0;
      auVar19._24_4_ = 0x7fe07fe0;
      auVar19._28_4_ = 0x7fe07fe0;
      auVar166 = vpandq_avx512vl(auVar108,auVar19);
      auVar108 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0x60);
      auVar124 = vpternlogq_avx512vl(local_540,auVar172,auVar108,0x80);
      auVar142 = vpandq_avx512vl(auVar108,auVar165);
      auVar170 = vpternlogq_avx512vl(auVar124,auVar166,auVar170,0xfe);
      auVar166 = vpandq_avx512vl(auVar128,auVar143);
      auVar143 = vpand_avx2(auVar108,auVar143);
      auVar124 = vpsrlw_avx2(auVar142,6);
      auVar20._8_4_ = 0x3c003c0;
      auVar20._0_8_ = 0x3c003c003c003c0;
      auVar20._12_4_ = 0x3c003c0;
      auVar20._16_4_ = 0x3c003c0;
      auVar20._20_4_ = 0x3c003c0;
      auVar20._24_4_ = 0x3c003c0;
      auVar20._28_4_ = 0x3c003c0;
      auVar124 = vpandq_avx512vl(auVar124,auVar20);
      auVar65._8_8_ = uStack_438;
      auVar65._0_8_ = local_440;
      auVar65._16_8_ = uStack_430;
      auVar65._24_8_ = uStack_428;
      auVar142 = vpsrlw_avx2(auVar166,2);
      auVar166 = vpsrlw_avx2(auVar143,1);
      auVar143._8_4_ = 0x3fe03fe0;
      auVar143._0_8_ = 0x3fe03fe03fe03fe0;
      auVar143._12_4_ = 0x3fe03fe0;
      auVar143._16_4_ = 0x3fe03fe0;
      auVar143._20_4_ = 0x3fe03fe0;
      auVar143._24_4_ = 0x3fe03fe0;
      auVar143._28_4_ = 0x3fe03fe0;
      auVar143 = vpandq_avx512vl(auVar142,auVar143);
      auVar21._8_4_ = 0x7fc07fc0;
      auVar21._0_8_ = 0x7fc07fc07fc07fc0;
      auVar21._12_4_ = 0x7fc07fc0;
      auVar21._16_4_ = 0x7fc07fc0;
      auVar21._20_4_ = 0x7fc07fc0;
      auVar21._24_4_ = 0x7fc07fc0;
      auVar21._28_4_ = 0x7fc07fc0;
      auVar166 = vpandq_avx512vl(auVar166,auVar21);
      auVar130 = vpternlogq_avx512vl(auVar166,auVar143,auVar130,0xfe);
      auVar166 = vpandq_avx512vl(auVar128,local_500);
      auVar143 = vpand_avx2(auVar108,local_500);
      auVar142 = vpsrlw_avx2(auVar166,3);
      auVar166 = vpsrlw_avx2(auVar143,2);
      auVar22._8_4_ = 0x1fe01fe0;
      auVar22._0_8_ = 0x1fe01fe01fe01fe0;
      auVar22._12_4_ = 0x1fe01fe0;
      auVar22._16_4_ = 0x1fe01fe0;
      auVar22._20_4_ = 0x1fe01fe0;
      auVar22._24_4_ = 0x1fe01fe0;
      auVar22._28_4_ = 0x1fe01fe0;
      auVar143 = vpandq_avx512vl(auVar142,auVar22);
      auVar23._8_4_ = 0x3fc03fc0;
      auVar23._0_8_ = 0x3fc03fc03fc03fc0;
      auVar23._12_4_ = 0x3fc03fc0;
      auVar23._16_4_ = 0x3fc03fc0;
      auVar23._20_4_ = 0x3fc03fc0;
      auVar23._24_4_ = 0x3fc03fc0;
      auVar23._28_4_ = 0x3fc03fc0;
      auVar166 = vpandq_avx512vl(auVar166,auVar23);
      auVar131 = vpternlogq_avx512vl(auVar166,auVar143,auVar131,0xfe);
      auVar166 = vpandq_avx512vl(auVar128,local_4e0);
      auVar143 = vpand_avx2(auVar108,local_4e0);
      auVar142 = vpsrlw_avx2(auVar166,4);
      auVar166 = vpsrlw_avx2(auVar143,3);
      auVar24._8_4_ = 0xfe00fe0;
      auVar24._0_8_ = 0xfe00fe00fe00fe0;
      auVar24._12_4_ = 0xfe00fe0;
      auVar24._16_4_ = 0xfe00fe0;
      auVar24._20_4_ = 0xfe00fe0;
      auVar24._24_4_ = 0xfe00fe0;
      auVar24._28_4_ = 0xfe00fe0;
      auVar143 = vpandq_avx512vl(auVar142,auVar24);
      auVar25._8_4_ = 0x1fc01fc0;
      auVar25._0_8_ = 0x1fc01fc01fc01fc0;
      auVar25._12_4_ = 0x1fc01fc0;
      auVar25._16_4_ = 0x1fc01fc0;
      auVar25._20_4_ = 0x1fc01fc0;
      auVar25._24_4_ = 0x1fc01fc0;
      auVar25._28_4_ = 0x1fc01fc0;
      auVar166 = vpandq_avx512vl(auVar166,auVar25);
      auVar132 = vpternlogq_avx512vl(auVar166,auVar143,auVar132,0xfe);
      auVar166 = vpandq_avx512vl(auVar128,local_4c0);
      auVar143 = vpand_avx2(auVar108,local_4c0);
      auVar142 = vpsrlw_avx2(auVar166,5);
      auVar166 = vpsrlw_avx2(auVar143,4);
      auVar26._8_4_ = 0x7e007e0;
      auVar26._0_8_ = 0x7e007e007e007e0;
      auVar26._12_4_ = 0x7e007e0;
      auVar26._16_4_ = 0x7e007e0;
      auVar26._20_4_ = 0x7e007e0;
      auVar26._24_4_ = 0x7e007e0;
      auVar26._28_4_ = 0x7e007e0;
      auVar143 = vpandq_avx512vl(auVar142,auVar26);
      auVar27._8_4_ = 0xfc00fc0;
      auVar27._0_8_ = 0xfc00fc00fc00fc0;
      auVar27._12_4_ = 0xfc00fc0;
      auVar27._16_4_ = 0xfc00fc0;
      auVar27._20_4_ = 0xfc00fc0;
      auVar27._24_4_ = 0xfc00fc0;
      auVar27._28_4_ = 0xfc00fc0;
      auVar166 = vpandq_avx512vl(auVar166,auVar27);
      auVar126 = vpternlogq_avx512vl(auVar166,auVar143,auVar126,0xfe);
      auVar166 = vpandq_avx512vl(auVar128,local_4a0);
      auVar143 = vpand_avx2(auVar108,local_4a0);
      auVar75._8_8_ = local_600._8_8_;
      auVar75._0_8_ = local_600._0_8_;
      auVar75._16_8_ = local_600._16_8_;
      auVar75._24_8_ = local_600._24_8_;
      auVar142 = vmovdqa64_avx512vl(auVar75);
      auVar121 = vpsrlw_avx2(auVar166,6);
      auVar166 = vpsrlw_avx2(auVar143,5);
      auVar28._8_4_ = 0x3e003e0;
      auVar28._0_8_ = 0x3e003e003e003e0;
      auVar28._12_4_ = 0x3e003e0;
      auVar28._16_4_ = 0x3e003e0;
      auVar28._20_4_ = 0x3e003e0;
      auVar28._24_4_ = 0x3e003e0;
      auVar28._28_4_ = 0x3e003e0;
      auVar143 = vpandq_avx512vl(auVar121,auVar28);
      auVar29._8_4_ = 0x7c007c0;
      auVar29._0_8_ = 0x7c007c007c007c0;
      auVar29._12_4_ = 0x7c007c0;
      auVar29._16_4_ = 0x7c007c0;
      auVar29._20_4_ = 0x7c007c0;
      auVar29._24_4_ = 0x7c007c0;
      auVar29._28_4_ = 0x7c007c0;
      auVar166 = vpandq_avx512vl(auVar166,auVar29);
      auVar133 = vpternlogq_avx512vl(auVar166,auVar143,auVar133,0xfe);
      auVar143 = vpandq_avx512vl(auVar128,auVar165);
      auVar165 = vmovdqa64_avx512vl(local_500);
      auVar143 = vpsrlw_avx2(auVar143,7);
      auVar30._8_4_ = 0x1e001e0;
      auVar30._0_8_ = 0x1e001e001e001e0;
      auVar30._12_4_ = 0x1e001e0;
      auVar30._16_4_ = 0x1e001e0;
      auVar30._20_4_ = 0x1e001e0;
      auVar30._24_4_ = 0x1e001e0;
      auVar30._28_4_ = 0x1e001e0;
      auVar143 = vpandq_avx512vl(auVar143,auVar30);
      auVar127 = vpternlogq_avx512vl(auVar124,auVar143,auVar127,0xfe);
      auVar166 = vpandq_avx512vl(auVar128,auVar70);
      auVar143 = vpand_avx2(auVar70,auVar108);
      auVar166 = vpsrlw_avx2(auVar166,8);
      auVar143 = vpsrlw_avx2(auVar143,7);
      auVar31._8_4_ = 0x1c001c0;
      auVar31._0_8_ = 0x1c001c001c001c0;
      auVar31._12_4_ = 0x1c001c0;
      auVar31._16_4_ = 0x1c001c0;
      auVar31._20_4_ = 0x1c001c0;
      auVar31._24_4_ = 0x1c001c0;
      auVar31._28_4_ = 0x1c001c0;
      auVar143 = vpandq_avx512vl(auVar143,auVar31);
      auVar32._8_4_ = 0xe000e0;
      auVar32._0_8_ = 0xe000e000e000e0;
      auVar32._12_4_ = 0xe000e0;
      auVar32._16_4_ = 0xe000e0;
      auVar32._20_4_ = 0xe000e0;
      auVar32._24_4_ = 0xe000e0;
      auVar32._28_4_ = 0xe000e0;
      auVar166 = vpandq_avx512vl(auVar166,auVar32);
      auVar124 = vpandq_avx512vl(auVar128,auVar98);
      auVar124 = vpsrlw_avx2(auVar124,10);
      auVar33._8_4_ = 0x200020;
      auVar33._0_8_ = 0x20002000200020;
      auVar33._12_4_ = 0x200020;
      auVar33._16_4_ = 0x200020;
      auVar33._20_4_ = 0x200020;
      auVar33._24_4_ = 0x200020;
      auVar33._28_4_ = 0x200020;
      auVar124 = vpandq_avx512vl(auVar124,auVar33);
      auVar134 = vpternlogq_avx512vl(auVar143,auVar166,auVar134,0xfe);
      auVar166 = vpandq_avx512vl(auVar128,auVar65);
      auVar143 = vpand_avx2(auVar65,auVar108);
      auVar166 = vpsrlw_avx2(auVar166,9);
      auVar128 = vpsrlw_avx2(auVar143,8);
      auVar34._8_4_ = 0x600060;
      auVar34._0_8_ = 0x60006000600060;
      auVar34._12_4_ = 0x600060;
      auVar34._16_4_ = 0x600060;
      auVar34._20_4_ = 0x600060;
      auVar34._24_4_ = 0x600060;
      auVar34._28_4_ = 0x600060;
      auVar143 = vpandq_avx512vl(auVar166,auVar34);
      auVar35._8_4_ = 0xc000c0;
      auVar35._0_8_ = 0xc000c000c000c0;
      auVar35._12_4_ = 0xc000c0;
      auVar35._16_4_ = 0xc000c0;
      auVar35._20_4_ = 0xc000c0;
      auVar35._24_4_ = 0xc000c0;
      auVar35._28_4_ = 0xc000c0;
      auVar166 = vpandq_avx512vl(auVar128,auVar35);
      auVar118 = vpternlogq_avx512vl(auVar166,auVar143,auVar118,0xfe);
      auVar143 = vpandq_avx512vl(auVar108,auVar142);
      auVar128 = vpsllw_avx2(auVar143,6);
      auVar143 = vpand_avx2(auVar98,auVar108);
      auVar143 = vpsrlw_avx2(auVar143,9);
      auVar36._8_4_ = 0x400040;
      auVar36._0_8_ = 0x40004000400040;
      auVar36._12_4_ = 0x400040;
      auVar36._16_4_ = 0x400040;
      auVar36._20_4_ = 0x400040;
      auVar36._24_4_ = 0x400040;
      auVar36._28_4_ = 0x400040;
      auVar166 = vpandq_avx512vl(auVar143,auVar36);
      auVar143 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0x70);
      auVar140 = vpternlogq_avx512vl(auVar166,auVar124,auVar140,0xfe);
      auVar166 = vpandq_avx512vl(auVar142,auVar143);
      auVar166 = vpsllw_avx512vl(auVar166,7);
      auVar139 = vpternlogq_avx512vl(auVar166,auVar139,auVar128,0xfe);
      auVar171._8_8_ = 0xff80ff80ff80ff80;
      auVar171._0_8_ = 0xff80ff80ff80ff80;
      auVar171._16_8_ = 0xff80ff80ff80ff80;
      auVar171._24_8_ = 0xff80ff80ff80ff80;
      auVar166 = vpand_avx2(local_5e0,auVar108);
      auVar124 = vpand_avx2(local_5e0,auVar143);
      auVar124 = vpsllw_avx2(auVar124,6);
      auVar166 = vpsllw_avx2(auVar166,5);
      auVar124 = vpandq_avx512vl(auVar124,auVar171);
      auVar166 = vpand_avx2(auVar166,auVar172);
      auVar164 = vpternlogq_avx512vl(auVar124,auVar166,auVar164,0xfe);
      auVar166 = vpand_avx2(local_5c0,auVar108);
      auVar124 = vpand_avx2(local_5c0,auVar143);
      auVar124 = vpsllw_avx2(auVar124,5);
      auVar166 = vpsllw_avx2(auVar166,4);
      auVar124 = vpandq_avx512vl(auVar124,auVar171);
      auVar142 = vpandq_avx512vl(auVar119,auVar143);
      auVar166 = vpand_avx2(auVar166,auVar172);
      auVar142 = vpsllw_avx2(auVar142,4);
      auVar135 = vpternlogq_avx512vl(auVar124,auVar166,auVar135,0xfe);
      auVar166 = vpandq_avx512vl(auVar108,auVar119);
      auVar119 = vmovdqa64_avx512vl(local_4e0);
      auVar124 = vpandq_avx512vl(auVar142,auVar171);
      auVar166 = vpsllw_avx2(auVar166,3);
      auVar166 = vpand_avx2(auVar166,auVar172);
      auVar137 = vpternlogq_avx512vl(auVar124,auVar166,auVar137,0xfe);
      auVar166 = vpand_avx2(local_580,auVar108);
      auVar108 = vpandq_avx512vl(auVar108,auVar141);
      auVar124 = vpand_avx2(local_580,auVar143);
      auVar166 = vpsllw_avx2(auVar166,2);
      auVar108 = vpaddw_avx2(auVar108,auVar108);
      auVar124 = vpsllw_avx2(auVar124,3);
      auVar166 = vpand_avx2(auVar166,auVar172);
      auVar108 = vpand_avx2(auVar172,auVar108);
      auVar124 = vpandq_avx512vl(auVar124,auVar171);
      auVar138 = vpternlogq_avx512vl(auVar124,auVar166,auVar138,0xfe);
      auVar166 = vpandq_avx512vl(auVar141,auVar143);
      auVar169._8_2_ = 0xff00;
      auVar169._0_8_ = 0xff00ff00ff00ff00;
      auVar169._10_2_ = 0xff00;
      auVar169._12_2_ = 0xff00;
      auVar169._14_2_ = 0xff00;
      auVar169._16_2_ = 0xff00;
      auVar169._18_2_ = 0xff00;
      auVar169._20_2_ = 0xff00;
      auVar169._22_2_ = 0xff00;
      auVar169._24_2_ = 0xff00;
      auVar169._26_2_ = 0xff00;
      auVar169._28_2_ = 0xff00;
      auVar169._30_2_ = 0xff00;
      auVar141 = vmovdqa64_avx512vl(local_4c0);
      auVar166 = vpsllw_avx2(auVar166,2);
      auVar166 = vpandq_avx512vl(auVar166,auVar171);
      auVar125 = vpternlogq_avx512vl(auVar166,auVar108,auVar125,0xfe);
      auVar108 = vpand_avx2(local_540,auVar143);
      auVar108 = vpaddw_avx2(auVar108,auVar108);
      auVar166 = vpand_avx2(auVar171,auVar108);
      auVar108 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0x80);
      auVar124 = vpand_avx2(local_540,auVar108);
      auVar124 = vpsllw_avx2(auVar124,2);
      auVar142 = vpandq_avx512vl(auVar124,auVar169);
      auVar124 = vpand_avx2(auVar108,auVar114);
      auVar170 = vpternlogq_avx512vl(auVar142,auVar166,auVar170,0xfe);
      auVar166 = vpand_avx2(local_520,auVar108);
      auVar142 = vpternlogq_avx512vl(auVar171,auVar143,local_520,0x80);
      auVar166 = vpaddw_avx2(auVar166,auVar166);
      auVar166 = vpandq_avx512vl(auVar166,auVar169);
      auVar99._8_8_ = uStack_418;
      auVar99._0_8_ = local_420;
      auVar99._16_8_ = uStack_410;
      auVar99._24_8_ = uStack_408;
      auVar130 = vpternlogq_avx512vl(auVar166,auVar142,auVar130,0xfe);
      auVar166 = vpandq_avx512vl(auVar165,auVar143);
      auVar142 = vpandq_avx512vl(auVar108,auVar119);
      auVar166 = vpsrlw_avx2(auVar166,1);
      auVar37._8_4_ = 0x7f807f80;
      auVar37._0_8_ = 0x7f807f807f807f80;
      auVar37._12_4_ = 0x7f807f80;
      auVar37._16_4_ = 0x7f807f80;
      auVar37._20_4_ = 0x7f807f80;
      auVar37._24_4_ = 0x7f807f80;
      auVar37._28_4_ = 0x7f807f80;
      auVar166 = vpandq_avx512vl(auVar166,auVar37);
      auVar142 = vpsrlw_avx2(auVar142,1);
      auVar38._8_4_ = 0x7f007f00;
      auVar38._0_8_ = 0x7f007f007f007f00;
      auVar38._12_4_ = 0x7f007f00;
      auVar38._16_4_ = 0x7f007f00;
      auVar38._20_4_ = 0x7f007f00;
      auVar38._24_4_ = 0x7f007f00;
      auVar38._28_4_ = 0x7f007f00;
      auVar142 = vpandq_avx512vl(auVar142,auVar38);
      auVar128 = vpandq_avx512vl(auVar108,auVar141);
      auVar128 = vpsrlw_avx2(auVar128,2);
      auVar39._8_4_ = 0x3f003f00;
      auVar39._0_8_ = 0x3f003f003f003f00;
      auVar39._12_4_ = 0x3f003f00;
      auVar39._16_4_ = 0x3f003f00;
      auVar39._20_4_ = 0x3f003f00;
      auVar39._24_4_ = 0x3f003f00;
      auVar39._28_4_ = 0x3f003f00;
      auVar128 = vpandq_avx512vl(auVar128,auVar39);
      auVar131 = vpternlogq_avx512vl(auVar124,auVar166,auVar131,0xfe);
      auVar166 = vpandq_avx512vl(auVar119,auVar143);
      auVar66._8_8_ = uStack_438;
      auVar66._0_8_ = local_440;
      auVar66._16_8_ = uStack_430;
      auVar66._24_8_ = uStack_428;
      auVar166 = vpsrlw_avx2(auVar166,2);
      auVar40._8_4_ = 0x3f803f80;
      auVar40._0_8_ = 0x3f803f803f803f80;
      auVar40._12_4_ = 0x3f803f80;
      auVar40._16_4_ = 0x3f803f80;
      auVar40._20_4_ = 0x3f803f80;
      auVar40._24_4_ = 0x3f803f80;
      auVar40._28_4_ = 0x3f803f80;
      auVar166 = vpandq_avx512vl(auVar166,auVar40);
      auVar132 = vpternlogq_avx512vl(auVar142,auVar166,auVar132,0xfe);
      auVar166 = vpandq_avx512vl(auVar141,auVar143);
      auVar166 = vpsrlw_avx2(auVar166,3);
      auVar41._8_4_ = 0x1f801f80;
      auVar41._0_8_ = 0x1f801f801f801f80;
      auVar41._12_4_ = 0x1f801f80;
      auVar41._16_4_ = 0x1f801f80;
      auVar41._20_4_ = 0x1f801f80;
      auVar41._24_4_ = 0x1f801f80;
      auVar41._28_4_ = 0x1f801f80;
      auVar124 = vpandq_avx512vl(auVar166,auVar41);
      auVar166 = vpand_avx2(auVar108,local_4a0);
      auVar126 = vpternlogq_avx512vl(auVar128,auVar124,auVar126,0xfe);
      auVar124 = vpand_avx2(auVar143,local_4a0);
      auVar166 = vpsrlw_avx2(auVar166,3);
      auVar42._8_4_ = 0x1f001f00;
      auVar42._0_8_ = 0x1f001f001f001f00;
      auVar42._12_4_ = 0x1f001f00;
      auVar42._16_4_ = 0x1f001f00;
      auVar42._20_4_ = 0x1f001f00;
      auVar42._24_4_ = 0x1f001f00;
      auVar42._28_4_ = 0x1f001f00;
      auVar142 = vpandq_avx512vl(auVar166,auVar42);
      auVar166 = vpsrlw_avx2(auVar124,4);
      auVar43._8_4_ = 0xf800f80;
      auVar43._0_8_ = 0xf800f800f800f80;
      auVar43._12_4_ = 0xf800f80;
      auVar43._16_4_ = 0xf800f80;
      auVar43._20_4_ = 0xf800f80;
      auVar43._24_4_ = 0xf800f80;
      auVar43._28_4_ = 0xf800f80;
      auVar124 = vpandq_avx512vl(auVar166,auVar43);
      auVar166 = vpand_avx2(auVar108,auVar107);
      auVar133 = vpternlogq_avx512vl(auVar142,auVar124,auVar133,0xfe);
      auVar124 = vpand_avx2(auVar143,auVar107);
      auVar166 = vpsrlw_avx2(auVar166,4);
      auVar44._8_4_ = 0xf000f00;
      auVar44._0_8_ = 0xf000f000f000f00;
      auVar44._12_4_ = 0xf000f00;
      auVar44._16_4_ = 0xf000f00;
      auVar44._20_4_ = 0xf000f00;
      auVar44._24_4_ = 0xf000f00;
      auVar44._28_4_ = 0xf000f00;
      auVar166 = vpandq_avx512vl(auVar166,auVar44);
      auVar71._8_8_ = uStack_458;
      auVar71._0_8_ = local_460;
      auVar71._16_8_ = uStack_450;
      auVar71._24_8_ = uStack_448;
      auVar76._8_8_ = local_600._8_8_;
      auVar76._0_8_ = local_600._0_8_;
      auVar76._16_8_ = local_600._16_8_;
      auVar76._24_8_ = local_600._24_8_;
      auVar124 = vpsrlw_avx2(auVar124,5);
      auVar45._8_4_ = 0x7800780;
      auVar45._0_8_ = 0x780078007800780;
      auVar45._12_4_ = 0x7800780;
      auVar45._16_4_ = 0x7800780;
      auVar45._20_4_ = 0x7800780;
      auVar45._24_4_ = 0x7800780;
      auVar45._28_4_ = 0x7800780;
      auVar124 = vpandq_avx512vl(auVar124,auVar45);
      auVar127 = vpternlogq_avx512vl(auVar166,auVar124,auVar127,0xfe);
      auVar166 = vpand_avx2(auVar143,auVar71);
      auVar124 = vpand_avx2(auVar108,auVar71);
      auVar166 = vpsrlw_avx2(auVar166,6);
      auVar124 = vpsrlw_avx2(auVar124,5);
      auVar46._8_4_ = 0x7000700;
      auVar46._0_8_ = 0x700070007000700;
      auVar46._12_4_ = 0x7000700;
      auVar46._16_4_ = 0x7000700;
      auVar46._20_4_ = 0x7000700;
      auVar46._24_4_ = 0x7000700;
      auVar46._28_4_ = 0x7000700;
      auVar124 = vpandq_avx512vl(auVar124,auVar46);
      auVar47._8_4_ = 0x3800380;
      auVar47._0_8_ = 0x380038003800380;
      auVar47._12_4_ = 0x3800380;
      auVar47._16_4_ = 0x3800380;
      auVar47._20_4_ = 0x3800380;
      auVar47._24_4_ = 0x3800380;
      auVar47._28_4_ = 0x3800380;
      auVar142 = vpandq_avx512vl(auVar166,auVar47);
      auVar166 = vpand_avx2(auVar99,auVar143);
      auVar166 = vpsrlw_avx2(auVar166,8);
      auVar48._8_4_ = 0x800080;
      auVar48._0_8_ = 0x80008000800080;
      auVar48._12_4_ = 0x800080;
      auVar48._16_4_ = 0x800080;
      auVar48._20_4_ = 0x800080;
      auVar48._24_4_ = 0x800080;
      auVar48._28_4_ = 0x800080;
      auVar128 = vpandq_avx512vl(auVar166,auVar48);
      auVar134 = vpternlogq_avx512vl(auVar124,auVar142,auVar134,0xfe);
      auVar166 = vpand_avx2(auVar143,auVar66);
      auVar124 = vpand_avx2(auVar108,auVar66);
      auVar143 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0x90);
      auVar124 = vpsrlw_avx2(auVar124,6);
      auVar49._8_4_ = 0x3000300;
      auVar49._0_8_ = 0x300030003000300;
      auVar49._12_4_ = 0x3000300;
      auVar49._16_4_ = 0x3000300;
      auVar49._20_4_ = 0x3000300;
      auVar49._24_4_ = 0x3000300;
      auVar49._28_4_ = 0x3000300;
      auVar142 = vpandq_avx512vl(auVar124,auVar49);
      auVar124 = vpand_avx2(auVar99,auVar108);
      auVar166 = vpsrlw_avx2(auVar166,7);
      auVar50._8_4_ = 0x1800180;
      auVar50._0_8_ = 0x180018001800180;
      auVar50._12_4_ = 0x1800180;
      auVar50._16_4_ = 0x1800180;
      auVar50._20_4_ = 0x1800180;
      auVar50._24_4_ = 0x1800180;
      auVar50._28_4_ = 0x1800180;
      auVar166 = vpandq_avx512vl(auVar166,auVar50);
      auVar124 = vpsrlw_avx2(auVar124,7);
      auVar51._8_4_ = 0x1000100;
      auVar51._0_8_ = 0x100010001000100;
      auVar51._12_4_ = 0x1000100;
      auVar51._16_4_ = 0x1000100;
      auVar51._20_4_ = 0x1000100;
      auVar51._24_4_ = 0x1000100;
      auVar51._28_4_ = 0x1000100;
      auVar124 = vpandq_avx512vl(auVar124,auVar51);
      auVar118 = vpternlogq_avx512vl(auVar142,auVar166,auVar118,0xfe);
      auVar166 = vpand_avx2(auVar108,auVar76);
      auVar140 = vpternlogq_avx512vl(auVar124,auVar128,auVar140,0xfe);
      auVar124 = vpand_avx2(auVar143,auVar76);
      auVar166 = vpsllw_avx2(auVar166,8);
      auVar124 = vpsllw_avx2(auVar124,9);
      auVar139 = vpternlogq_avx512vl(auVar124,auVar139,auVar166,0xfe);
      auVar142 = vpbroadcastq_avx512vl(ZEXT816(0xfe00fe00fe00fe00));
      auVar166 = vpand_avx2(auVar108,local_5e0);
      auVar124 = vpand_avx2(auVar143,local_5e0);
      auVar124 = vpsllw_avx2(auVar124,8);
      auVar166 = vpsllw_avx2(auVar166,7);
      auVar124 = vpandq_avx512vl(auVar124,auVar142);
      auVar166 = vpand_avx2(auVar169,auVar166);
      auVar164 = vpternlogq_avx512vl(auVar124,auVar166,auVar164,0xfe);
      auVar128 = vpbroadcastq_avx512vl(ZEXT816(0xfc00fc00fc00fc00));
      auVar166 = vpand_avx2(auVar108,local_5c0);
      auVar124 = vpand_avx2(auVar143,local_5c0);
      auVar124 = vpsllw_avx2(auVar124,7);
      auVar166 = vpsllw_avx2(auVar166,6);
      auVar124 = vpandq_avx512vl(auVar124,auVar142);
      auVar166 = vpand_avx2(auVar169,auVar166);
      auVar135 = vpternlogq_avx512vl(auVar124,auVar166,auVar135,0xfe);
      auVar121 = vmovdqa64_avx512vl(local_580);
      auVar166 = vpand_avx2(auVar108,local_5a0);
      auVar124 = vpand_avx2(auVar143,local_5a0);
      auVar166 = vpsllw_avx2(auVar166,5);
      auVar124 = vpsllw_avx2(auVar124,6);
      auVar166 = vpand_avx2(auVar169,auVar166);
      auVar124 = vpandq_avx512vl(auVar124,auVar142);
      auVar137 = vpternlogq_avx512vl(auVar124,auVar166,auVar137,0xfe);
      auVar129 = vmovdqa64_avx512vl(local_560);
      auVar166 = vpandq_avx512vl(auVar108,auVar121);
      auVar166 = vpsllw_avx2(auVar166,4);
      auVar166 = vpand_avx2(auVar169,auVar166);
      auVar108 = vpandq_avx512vl(auVar108,auVar129);
      auVar108 = vpsllw_avx2(auVar108,3);
      auVar108 = vpand_avx2(auVar169,auVar108);
      auVar124 = vpandq_avx512vl(auVar143,auVar121);
      auVar124 = vpsllw_avx2(auVar124,5);
      auVar124 = vpandq_avx512vl(auVar124,auVar142);
      auVar138 = vpternlogq_avx512vl(auVar124,auVar166,auVar138,0xfe);
      auVar117 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(data + lVar103 * 0x10 + 0xa0));
      auVar166 = vpandq_avx512vl(auVar143,auVar129);
      auVar166 = vpsllw_avx2(auVar166,4);
      auVar166 = vpandq_avx512vl(auVar166,auVar142);
      auVar120 = vpternlogq_avx512vl(auVar166,auVar108,auVar125,0xfe);
      auVar108 = vpand_avx2(auVar143,local_540);
      auVar108 = vpsllw_avx2(auVar108,3);
      auVar108 = vpandq_avx512vl(auVar108,auVar142);
      auVar166 = vpandq_avx512vl(auVar117,local_540);
      auVar166 = vpsllw_avx2(auVar166,4);
      auVar166 = vpandq_avx512vl(auVar166,auVar128);
      auVar170 = vpternlogq_avx512vl(auVar166,auVar108,auVar170,0xfe);
      auVar108 = vpand_avx2(auVar143,local_520);
      auVar166 = vpandq_avx512vl(auVar117,local_520);
      auVar108 = vpsllw_avx2(auVar108,2);
      auVar166 = vpsllw_avx2(auVar166,3);
      auVar108 = vpandq_avx512vl(auVar108,auVar142);
      auVar166 = vpandq_avx512vl(auVar166,auVar128);
      auVar130 = vpternlogq_avx512vl(auVar166,auVar108,auVar130,0xfe);
      auVar108 = vpandq_avx512vl(auVar143,auVar165);
      auVar166 = vpandq_avx512vl(auVar117,auVar165);
      auVar108 = vpaddw_avx2(auVar108,auVar108);
      auVar166 = vpsllw_avx512vl(auVar166,2);
      auVar108 = vpandq_avx512vl(auVar108,auVar142);
      auVar166 = vpandq_avx512vl(auVar166,auVar128);
      auVar166 = vpternlogq_avx512vl(auVar166,auVar108,auVar131,0xfe);
      auVar124 = vpand_avx2(auVar143,auVar115);
      auVar108 = vpandq_avx512vl(auVar117,auVar119);
      auVar108 = vpaddw_avx2(auVar108,auVar108);
      auVar166 = vmovdqa64_avx512vl(auVar166);
      auVar108 = vpandq_avx512vl(auVar108,auVar128);
      auVar131 = vpternlogq_avx512vl(auVar108,auVar124,auVar132,0xfe);
      auVar124 = vpandq_avx512vl(auVar143,auVar141);
      auVar125 = vpandq_avx512vl(auVar117,auVar116);
      auVar108 = vmovdqa64_avx512vl(local_480);
      auVar124 = vpsrlw_avx2(auVar124,1);
      auVar52._8_4_ = 0x7e007e00;
      auVar52._0_8_ = 0x7e007e007e007e00;
      auVar52._12_4_ = 0x7e007e00;
      auVar52._16_4_ = 0x7e007e00;
      auVar52._20_4_ = 0x7e007e00;
      auVar52._24_4_ = 0x7e007e00;
      auVar52._28_4_ = 0x7e007e00;
      auVar124 = vpandq_avx512vl(auVar124,auVar52);
      auVar167._8_8_ = 0xf800f800f800f800;
      auVar167._0_8_ = 0xf800f800f800f800;
      auVar167._16_8_ = 0xf800f800f800f800;
      auVar167._24_8_ = 0xf800f800f800f800;
      auVar132 = vpternlogq_avx512vl(auVar125,auVar124,auVar126,0xfe);
      auVar124 = vpand_avx2(auVar143,local_4a0);
      auVar125 = vpandq_avx512vl(auVar117,local_4a0);
      auVar72._8_8_ = uStack_458;
      auVar72._0_8_ = local_460;
      auVar72._16_8_ = uStack_450;
      auVar72._24_8_ = uStack_448;
      auVar126 = vpsrlw_avx2(auVar124,2);
      auVar124 = vpsrlw_avx512vl(auVar125,1);
      auVar53._8_4_ = 0x3e003e00;
      auVar53._0_8_ = 0x3e003e003e003e00;
      auVar53._12_4_ = 0x3e003e00;
      auVar53._16_4_ = 0x3e003e00;
      auVar53._20_4_ = 0x3e003e00;
      auVar53._24_4_ = 0x3e003e00;
      auVar53._28_4_ = 0x3e003e00;
      auVar125 = vpandq_avx512vl(auVar126,auVar53);
      auVar54._8_4_ = 0x7c007c00;
      auVar54._0_8_ = 0x7c007c007c007c00;
      auVar54._12_4_ = 0x7c007c00;
      auVar54._16_4_ = 0x7c007c00;
      auVar54._20_4_ = 0x7c007c00;
      auVar54._24_4_ = 0x7c007c00;
      auVar54._28_4_ = 0x7c007c00;
      auVar124 = vpandq_avx512vl(auVar124,auVar54);
      auVar125 = vpternlogq_avx512vl(auVar124,auVar125,auVar133,0xfe);
      auVar124 = vpand_avx2(auVar143,auVar107);
      auVar126 = vpandq_avx512vl(auVar117,auVar107);
      auVar133 = vpsrlw_avx2(auVar124,3);
      auVar124 = vpsrlw_avx512vl(auVar126,2);
      auVar55._8_4_ = 0x1e001e00;
      auVar55._0_8_ = 0x1e001e001e001e00;
      auVar55._12_4_ = 0x1e001e00;
      auVar55._16_4_ = 0x1e001e00;
      auVar55._20_4_ = 0x1e001e00;
      auVar55._24_4_ = 0x1e001e00;
      auVar55._28_4_ = 0x1e001e00;
      auVar126 = vpandq_avx512vl(auVar133,auVar55);
      auVar56._8_4_ = 0x3c003c00;
      auVar56._0_8_ = 0x3c003c003c003c00;
      auVar56._12_4_ = 0x3c003c00;
      auVar56._16_4_ = 0x3c003c00;
      auVar56._20_4_ = 0x3c003c00;
      auVar56._24_4_ = 0x3c003c00;
      auVar56._28_4_ = 0x3c003c00;
      auVar133 = vpandq_avx512vl(auVar124,auVar56);
      auVar124 = vmovdqa64_avx512vl(auVar125);
      auVar126 = vpternlogq_avx512vl(auVar133,auVar126,auVar127,0xfe);
      auVar125 = vpand_avx2(auVar143,auVar72);
      auVar127 = vpandq_avx512vl(auVar117,auVar72);
      auVar67._8_8_ = uStack_438;
      auVar67._0_8_ = local_440;
      auVar67._16_8_ = uStack_430;
      auVar67._24_8_ = uStack_428;
      auVar125 = vpsrlw_avx2(auVar125,4);
      auVar133 = vpsrlw_avx2(auVar127,3);
      auVar57._8_4_ = 0xe000e00;
      auVar57._0_8_ = 0xe000e000e000e00;
      auVar57._12_4_ = 0xe000e00;
      auVar57._16_4_ = 0xe000e00;
      auVar57._20_4_ = 0xe000e00;
      auVar57._24_4_ = 0xe000e00;
      auVar57._28_4_ = 0xe000e00;
      auVar127 = vpandq_avx512vl(auVar125,auVar57);
      auVar58._8_4_ = 0x1c001c00;
      auVar58._0_8_ = 0x1c001c001c001c00;
      auVar58._12_4_ = 0x1c001c00;
      auVar58._16_4_ = 0x1c001c00;
      auVar58._20_4_ = 0x1c001c00;
      auVar58._24_4_ = 0x1c001c00;
      auVar58._28_4_ = 0x1c001c00;
      auVar133 = vpandq_avx512vl(auVar133,auVar58);
      auVar125 = vmovdqa64_avx512vl(auVar126);
      auVar127 = vpternlogq_avx512vl(auVar133,auVar127,auVar134,0xfe);
      auVar126 = vpand_avx2(auVar143,auVar67);
      auVar133 = vpandq_avx512vl(auVar117,auVar67);
      auVar100._8_8_ = uStack_418;
      auVar100._0_8_ = local_420;
      auVar100._16_8_ = uStack_410;
      auVar100._24_8_ = uStack_408;
      auVar126 = vpsrlw_avx2(auVar126,5);
      auVar133 = vpsrlw_avx2(auVar133,4);
      auVar59._8_4_ = 0x6000600;
      auVar59._0_8_ = 0x600060006000600;
      auVar59._12_4_ = 0x6000600;
      auVar59._16_4_ = 0x6000600;
      auVar59._20_4_ = 0x6000600;
      auVar59._24_4_ = 0x6000600;
      auVar59._28_4_ = 0x6000600;
      auVar126 = vpandq_avx512vl(auVar126,auVar59);
      auVar60._8_4_ = 0xc000c00;
      auVar60._0_8_ = 0xc000c000c000c00;
      auVar60._12_4_ = 0xc000c00;
      auVar60._16_4_ = 0xc000c00;
      auVar60._20_4_ = 0xc000c00;
      auVar60._24_4_ = 0xc000c00;
      auVar60._28_4_ = 0xc000c00;
      auVar133 = vpandq_avx512vl(auVar133,auVar60);
      auVar118 = vpternlogq_avx512vl(auVar133,auVar126,auVar118,0xfe);
      auVar143 = vpand_avx2(auVar143,auVar100);
      auVar126 = vpandq_avx512vl(auVar117,auVar100);
      auVar77._8_8_ = local_600._8_8_;
      auVar77._0_8_ = local_600._0_8_;
      auVar77._16_8_ = local_600._16_8_;
      auVar77._24_8_ = local_600._24_8_;
      auVar143 = vpsrlw_avx2(auVar143,6);
      auVar126 = vpsrlw_avx2(auVar126,5);
      auVar61._8_4_ = 0x2000200;
      auVar61._0_8_ = 0x200020002000200;
      auVar61._12_4_ = 0x2000200;
      auVar61._16_4_ = 0x2000200;
      auVar61._20_4_ = 0x2000200;
      auVar61._24_4_ = 0x2000200;
      auVar61._28_4_ = 0x2000200;
      auVar143 = vpandq_avx512vl(auVar143,auVar61);
      auVar62._8_4_ = 0x4000400;
      auVar62._0_8_ = 0x400040004000400;
      auVar62._12_4_ = 0x4000400;
      auVar62._16_4_ = 0x4000400;
      auVar62._20_4_ = 0x4000400;
      auVar62._24_4_ = 0x4000400;
      auVar62._28_4_ = 0x4000400;
      auVar126 = vpandq_avx512vl(auVar126,auVar62);
      auVar133 = vpternlogq_avx512vl(auVar126,auVar143,auVar140,0xfe);
      auVar143 = vpandq_avx512vl(auVar117,auVar77);
      auVar134 = vpsllw_avx2(auVar143,10);
      auVar143 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0xb0);
      auVar126 = vpand_avx2(auVar143,auVar77);
      auVar126 = vpsllw_avx2(auVar126,0xb);
      auVar134 = vpternlogq_avx512vl(auVar126,auVar139,auVar134,0xfe);
      auVar139 = vpandq_avx512vl(auVar117,local_5e0);
      auVar126 = vpand_avx2(auVar143,local_5e0);
      auVar139 = vpsllw_avx2(auVar139,9);
      auVar126 = vpsllw_avx2(auVar126,10);
      auVar139 = vpandq_avx512vl(auVar139,auVar128);
      auVar126 = vpand_avx2(auVar126,auVar167);
      auVar139 = vpternlogq_avx512vl(auVar126,auVar139,auVar164,0xfe);
      auVar140 = vpandq_avx512vl(auVar117,local_5c0);
      auVar126 = vpand_avx2(auVar143,local_5c0);
      auVar140 = vpsllw_avx2(auVar140,8);
      auVar126 = vpsllw_avx2(auVar126,9);
      auVar140 = vpandq_avx512vl(auVar140,auVar128);
      auVar126 = vpand_avx2(auVar167,auVar126);
      auVar135 = vpternlogq_avx512vl(auVar126,auVar140,auVar135,0xfe);
      auVar140 = vpandq_avx512vl(auVar117,local_5a0);
      auVar126 = vpand_avx2(auVar143,local_5a0);
      auVar140 = vpsllw_avx2(auVar140,7);
      auVar126 = vpsllw_avx2(auVar126,8);
      auVar140 = vpandq_avx512vl(auVar140,auVar128);
      auVar126 = vpand_avx2(auVar167,auVar126);
      auVar137 = vpternlogq_avx512vl(auVar126,auVar140,auVar137,0xfe);
      auVar126 = vpandq_avx512vl(auVar117,auVar121);
      auVar140 = vpandq_avx512vl(auVar117,auVar129);
      auVar164 = vpandq_avx512vl(auVar143,auVar121);
      auVar126 = vpsllw_avx2(auVar126,6);
      auVar119 = vpsllw_avx2(auVar140,5);
      auVar165 = vpsllw_avx2(auVar164,7);
      auVar140 = vpandq_avx512vl(auVar126,auVar128);
      auVar164 = vpandq_avx512vl(auVar119,auVar128);
      auVar126 = vpand_avx2(auVar167,auVar165);
      auVar138 = vpternlogq_avx512vl(auVar126,auVar140,auVar138,0xfe);
      auVar126 = vpand_avx2(auVar143,local_560);
      auVar153._8_8_ = 0x3800380038003800;
      auVar153._0_8_ = 0x3800380038003800;
      auVar153._16_8_ = 0x3800380038003800;
      auVar153._24_8_ = 0x3800380038003800;
      auVar126 = vpsllw_avx2(auVar126,6);
      auVar126 = vpand_avx2(auVar167,auVar126);
      auVar140 = vpternlogq_avx512vl(auVar126,auVar164,auVar120,0xfe);
      auVar126 = vpand_avx2(auVar143,local_540);
      auVar148._8_8_ = 0x7800780078007800;
      auVar148._0_8_ = 0x7800780078007800;
      auVar148._16_8_ = 0x7800780078007800;
      auVar148._24_8_ = 0x7800780078007800;
      auVar126 = vpsllw_avx2(auVar126,5);
      auVar164 = vpternlogq_avx512vl(auVar126,auVar170,auVar167,0xec);
      auVar126 = vpand_avx2(auVar143,local_520);
      auVar126 = vpsllw_avx2(auVar126,4);
      auVar130 = vpternlogq_avx512vl(auVar126,auVar130,auVar167,0xec);
      auVar126 = vpand_avx2(auVar143,local_500);
      auVar126 = vpsllw_avx2(auVar126,3);
      auVar126 = vpternlogq_avx512vl(auVar126,auVar167,auVar166,0xea);
      auVar166 = vpand_avx2(auVar143,local_4e0);
      auVar166 = vpsllw_avx2(auVar166,2);
      auVar131 = vpternlogq_avx512vl(auVar166,auVar167,auVar131,0xea);
      auVar166 = vpand_avx2(auVar143,local_4c0);
      auVar166 = vpaddw_avx2(auVar166,auVar166);
      auVar132 = vpternlogq_avx512vl(auVar166,auVar167,auVar132,0xea);
      auVar166 = vpand_avx2(auVar143,local_4a0);
      auVar170 = vpternlogq_avx512vl(auVar166,auVar167,auVar124,0xea);
      auVar168._8_8_ = 0x8000800080008000;
      auVar168._0_8_ = 0x8000800080008000;
      auVar168._16_8_ = 0x8000800080008000;
      auVar168._24_8_ = 0x8000800080008000;
      auVar143 = vpand_avx2(auVar143,local_480);
      auVar143 = vpsrlw_avx2(auVar143,1);
      auVar125 = vpternlogq_avx512vl(auVar143,auVar148,auVar125,0xea);
      auVar143 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0xb0);
      auVar82._8_8_ = uStack_458;
      auVar82._0_8_ = local_460;
      auVar82._16_8_ = uStack_450;
      auVar82._24_8_ = uStack_448;
      auVar166 = vpand_avx2(auVar143,auVar82);
      auVar166 = vpsrlw_avx2(auVar166,2);
      auVar127 = vpternlogq_avx512vl(auVar166,auVar153,auVar127,0xea);
      auVar154._8_8_ = 0x1800180018001800;
      auVar154._0_8_ = 0x1800180018001800;
      auVar154._16_8_ = 0x1800180018001800;
      auVar154._24_8_ = 0x1800180018001800;
      auVar87._8_8_ = uStack_438;
      auVar87._0_8_ = local_440;
      auVar87._16_8_ = uStack_430;
      auVar87._24_8_ = uStack_428;
      auVar166 = vpand_avx2(auVar143,auVar87);
      auVar92._8_8_ = uStack_418;
      auVar92._0_8_ = local_420;
      auVar92._16_8_ = uStack_410;
      auVar92._24_8_ = uStack_408;
      auVar143 = vpand_avx2(auVar143,auVar92);
      auVar166 = vpsrlw_avx2(auVar166,3);
      auVar118 = vpternlogq_avx512vl(auVar166,auVar154,auVar118,0xea);
      auVar143 = vpsrlw_avx2(auVar143,4);
      auVar155._8_8_ = 0xf000f000f000f000;
      auVar155._0_8_ = 0xf000f000f000f000;
      auVar155._16_8_ = 0xf000f000f000f000;
      auVar155._24_8_ = 0xf000f000f000f000;
      auVar149._8_8_ = 0x800080008000800;
      auVar149._0_8_ = 0x800080008000800;
      auVar149._16_8_ = 0x800080008000800;
      auVar149._24_8_ = 0x800080008000800;
      auVar133 = vpternlogq_avx512vl(auVar143,auVar149,auVar133,0xea);
      auVar143 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0xc0);
      auVar78._8_8_ = local_600._8_8_;
      auVar78._0_8_ = local_600._0_8_;
      auVar78._16_8_ = local_600._16_8_;
      auVar78._24_8_ = local_600._24_8_;
      auVar166 = vpand_avx2(auVar143,auVar78);
      auVar166 = vpsllw_avx2(auVar166,0xc);
      auVar124 = vpor_avx2(auVar166,auVar134);
      auVar166 = vpand_avx2(auVar143,local_5e0);
      auVar166 = vpsllw_avx2(auVar166,0xb);
      auVar134 = vpternlogq_avx512vl(auVar166,auVar155,auVar139,0xea);
      auVar166 = vpand_avx2(auVar143,local_5c0);
      auVar166 = vpsllw_avx2(auVar166,10);
      auVar135 = vpternlogq_avx512vl(auVar166,auVar155,auVar135,0xea);
      auVar166 = vpand_avx2(auVar143,local_5a0);
      auVar166 = vpsllw_avx2(auVar166,9);
      auVar137 = vpternlogq_avx512vl(auVar166,auVar155,auVar137,0xea);
      auVar166 = vpand_avx2(auVar143,local_580);
      auVar166 = vpsllw_avx2(auVar166,8);
      auVar138 = vpternlogq_avx512vl(auVar166,auVar155,auVar138,0xea);
      auVar166 = vpand_avx2(auVar143,local_560);
      auVar166 = vpsllw_avx2(auVar166,7);
      auVar139 = vpternlogq_avx512vl(auVar166,auVar155,auVar140,0xea);
      auVar166 = vpand_avx2(auVar143,local_540);
      auVar166 = vpsllw_avx2(auVar166,6);
      auVar140 = vpternlogq_avx512vl(auVar166,auVar155,auVar164,0xea);
      auVar166 = vpand_avx2(auVar143,local_520);
      auVar166 = vpsllw_avx2(auVar166,5);
      auVar130 = vpternlogq_avx512vl(auVar166,auVar155,auVar130,0xea);
      auVar166 = vpand_avx2(auVar143,local_500);
      auVar166 = vpsllw_avx2(auVar166,4);
      auVar126 = vpternlogq_avx512vl(auVar166,auVar155,auVar126,0xea);
      auVar166 = vpand_avx2(auVar143,local_4e0);
      auVar166 = vpsllw_avx2(auVar166,3);
      auVar131 = vpternlogq_avx512vl(auVar166,auVar155,auVar131,0xea);
      auVar166 = vpand_avx2(auVar143,local_4c0);
      auVar143 = vpand_avx2(auVar143,local_4a0);
      auVar166 = vpsllw_avx2(auVar166,2);
      auVar132 = vpternlogq_avx512vl(auVar166,auVar155,auVar132,0xea);
      auVar143 = vpaddw_avx2(auVar143,auVar143);
      auVar164 = vpternlogq_avx512vl(auVar143,auVar155,auVar170,0xea);
      auVar143 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0xc0);
      auVar166 = vpand_avx2(auVar143,local_480);
      auVar125 = vpternlogq_avx512vl(auVar166,auVar155,auVar125,0xea);
      auVar156._8_8_ = 0x7000700070007000;
      auVar156._0_8_ = 0x7000700070007000;
      auVar156._16_8_ = 0x7000700070007000;
      auVar156._24_8_ = 0x7000700070007000;
      auVar83._8_8_ = uStack_458;
      auVar83._0_8_ = local_460;
      auVar83._16_8_ = uStack_450;
      auVar83._24_8_ = uStack_448;
      auVar166 = vpand_avx2(auVar143,auVar83);
      auVar166 = vpsrlw_avx2(auVar166,1);
      auVar127 = vpternlogq_avx512vl(auVar166,auVar156,auVar127,0xea);
      auVar157._8_8_ = 0x3000300030003000;
      auVar157._0_8_ = 0x3000300030003000;
      auVar157._16_8_ = 0x3000300030003000;
      auVar157._24_8_ = 0x3000300030003000;
      auVar88._8_8_ = uStack_438;
      auVar88._0_8_ = local_440;
      auVar88._16_8_ = uStack_430;
      auVar88._24_8_ = uStack_428;
      auVar166 = vpand_avx2(auVar143,auVar88);
      auVar93._8_8_ = uStack_418;
      auVar93._0_8_ = local_420;
      auVar93._16_8_ = uStack_410;
      auVar93._24_8_ = uStack_408;
      auVar143 = vpand_avx2(auVar143,auVar93);
      auVar166 = vpsrlw_avx2(auVar166,2);
      auVar118 = vpternlogq_avx512vl(auVar166,auVar157,auVar118,0xea);
      auVar143 = vpsrlw_avx2(auVar143,3);
      auVar158._8_8_ = 0xe000e000e000e000;
      auVar158._0_8_ = 0xe000e000e000e000;
      auVar158._16_8_ = 0xe000e000e000e000;
      auVar158._24_8_ = 0xe000e000e000e000;
      auVar150._8_8_ = 0x1000100010001000;
      auVar150._0_8_ = 0x1000100010001000;
      auVar150._16_8_ = 0x1000100010001000;
      auVar150._24_8_ = 0x1000100010001000;
      auVar133 = vpternlogq_avx512vl(auVar143,auVar150,auVar133,0xea);
      auVar143 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0xd0);
      auVar79._8_8_ = local_600._8_8_;
      auVar79._0_8_ = local_600._0_8_;
      auVar79._16_8_ = local_600._16_8_;
      auVar79._24_8_ = local_600._24_8_;
      auVar166 = vpand_avx2(auVar143,auVar79);
      auVar166 = vpsllw_avx2(auVar166,0xd);
      auVar124 = vpor_avx2(auVar166,auVar124);
      auVar166 = vpand_avx2(auVar143,local_5e0);
      auVar166 = vpsllw_avx2(auVar166,0xc);
      auVar134 = vpternlogq_avx512vl(auVar166,auVar158,auVar134,0xea);
      auVar166 = vpand_avx2(auVar143,local_5c0);
      auVar166 = vpsllw_avx2(auVar166,0xb);
      auVar135 = vpternlogq_avx512vl(auVar166,auVar158,auVar135,0xea);
      auVar166 = vpand_avx2(auVar143,local_5a0);
      auVar166 = vpsllw_avx2(auVar166,10);
      auVar137 = vpternlogq_avx512vl(auVar166,auVar158,auVar137,0xea);
      auVar166 = vpand_avx2(auVar143,local_580);
      auVar166 = vpsllw_avx2(auVar166,9);
      auVar138 = vpternlogq_avx512vl(auVar166,auVar158,auVar138,0xea);
      auVar166 = vpand_avx2(auVar143,local_560);
      auVar166 = vpsllw_avx2(auVar166,8);
      auVar139 = vpternlogq_avx512vl(auVar166,auVar158,auVar139,0xea);
      auVar166 = vpand_avx2(auVar143,local_540);
      auVar166 = vpsllw_avx2(auVar166,7);
      auVar140 = vpternlogq_avx512vl(auVar166,auVar158,auVar140,0xea);
      auVar166 = vpand_avx2(auVar143,local_520);
      auVar166 = vpsllw_avx2(auVar166,6);
      auVar130 = vpternlogq_avx512vl(auVar166,auVar158,auVar130,0xea);
      auVar166 = vpand_avx2(auVar143,local_500);
      auVar166 = vpsllw_avx2(auVar166,5);
      auVar126 = vpternlogq_avx512vl(auVar166,auVar158,auVar126,0xea);
      auVar166 = vpand_avx2(auVar143,local_4e0);
      auVar166 = vpsllw_avx2(auVar166,4);
      auVar131 = vpternlogq_avx512vl(auVar166,auVar158,auVar131,0xea);
      auVar166 = vpand_avx2(auVar143,local_4c0);
      auVar143 = vpand_avx2(auVar143,local_4a0);
      auVar166 = vpsllw_avx2(auVar166,3);
      auVar132 = vpternlogq_avx512vl(auVar166,auVar158,auVar132,0xea);
      auVar143 = vpsllw_avx2(auVar143,2);
      auVar164 = vpternlogq_avx512vl(auVar143,auVar158,auVar164,0xea);
      auVar143 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0xd0);
      auVar166 = vpand_avx2(auVar143,local_480);
      auVar166 = vpaddw_avx2(auVar166,auVar166);
      auVar125 = vpternlogq_avx512vl(auVar166,auVar158,auVar125,0xea);
      auVar84._8_8_ = uStack_458;
      auVar84._0_8_ = local_460;
      auVar84._16_8_ = uStack_450;
      auVar84._24_8_ = uStack_448;
      auVar166 = vpand_avx2(auVar143,auVar84);
      auVar127 = vpternlogq_avx512vl(auVar166,auVar158,auVar127,0xea);
      auVar159._8_8_ = 0x6000600060006000;
      auVar159._0_8_ = 0x6000600060006000;
      auVar159._16_8_ = 0x6000600060006000;
      auVar159._24_8_ = 0x6000600060006000;
      auVar89._8_8_ = uStack_438;
      auVar89._0_8_ = local_440;
      auVar89._16_8_ = uStack_430;
      auVar89._24_8_ = uStack_428;
      auVar166 = vpand_avx2(auVar143,auVar89);
      auVar94._8_8_ = uStack_418;
      auVar94._0_8_ = local_420;
      auVar94._16_8_ = uStack_410;
      auVar94._24_8_ = uStack_408;
      auVar143 = vpand_avx2(auVar143,auVar94);
      auVar166 = vpsrlw_avx2(auVar166,1);
      auVar118 = vpternlogq_avx512vl(auVar166,auVar159,auVar118,0xea);
      auVar143 = vpsrlw_avx2(auVar143,2);
      auVar160._8_8_ = 0xc000c000c000c000;
      auVar160._0_8_ = 0xc000c000c000c000;
      auVar160._16_8_ = 0xc000c000c000c000;
      auVar160._24_8_ = 0xc000c000c000c000;
      auVar151._8_8_ = 0x2000200020002000;
      auVar151._0_8_ = 0x2000200020002000;
      auVar151._16_8_ = 0x2000200020002000;
      auVar151._24_8_ = 0x2000200020002000;
      auVar133 = vpternlogq_avx512vl(auVar143,auVar151,auVar133,0xea);
      auVar143 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0xe0);
      auVar80._8_8_ = local_600._8_8_;
      auVar80._0_8_ = local_600._0_8_;
      auVar80._16_8_ = local_600._16_8_;
      auVar80._24_8_ = local_600._24_8_;
      auVar166 = vpand_avx2(auVar143,auVar80);
      auVar166 = vpsllw_avx2(auVar166,0xe);
      auVar124 = vpor_avx2(auVar166,auVar124);
      auVar166 = vpand_avx2(auVar143,local_5e0);
      auVar166 = vpsllw_avx2(auVar166,0xd);
      auVar134 = vpternlogq_avx512vl(auVar166,auVar160,auVar134,0xea);
      auVar166 = vpand_avx2(auVar143,local_5c0);
      auVar166 = vpsllw_avx2(auVar166,0xc);
      auVar135 = vpternlogq_avx512vl(auVar166,auVar160,auVar135,0xea);
      auVar166 = vpand_avx2(auVar143,local_5a0);
      auVar166 = vpsllw_avx2(auVar166,0xb);
      auVar137 = vpternlogq_avx512vl(auVar166,auVar160,auVar137,0xea);
      auVar166 = vpand_avx2(auVar143,local_580);
      auVar166 = vpsllw_avx2(auVar166,10);
      auVar138 = vpternlogq_avx512vl(auVar166,auVar160,auVar138,0xea);
      auVar166 = vpand_avx2(auVar143,local_560);
      auVar166 = vpsllw_avx2(auVar166,9);
      auVar139 = vpternlogq_avx512vl(auVar166,auVar160,auVar139,0xea);
      auVar166 = vpand_avx2(auVar143,local_540);
      auVar166 = vpsllw_avx2(auVar166,8);
      auVar140 = vpternlogq_avx512vl(auVar166,auVar160,auVar140,0xea);
      auVar166 = vpand_avx2(auVar143,local_520);
      auVar166 = vpsllw_avx2(auVar166,7);
      auVar130 = vpternlogq_avx512vl(auVar166,auVar160,auVar130,0xea);
      auVar166 = vpand_avx2(auVar143,local_500);
      auVar166 = vpsllw_avx2(auVar166,6);
      auVar126 = vpternlogq_avx512vl(auVar166,auVar160,auVar126,0xea);
      auVar166 = vpand_avx2(auVar143,local_4e0);
      auVar166 = vpsllw_avx2(auVar166,5);
      auVar131 = vpternlogq_avx512vl(auVar166,auVar160,auVar131,0xea);
      auVar166 = vpand_avx2(auVar143,local_4c0);
      auVar143 = vpand_avx2(auVar143,local_4a0);
      auVar166 = vpsllw_avx2(auVar166,4);
      auVar132 = vpternlogq_avx512vl(auVar166,auVar160,auVar132,0xea);
      auVar143 = vpsllw_avx2(auVar143,3);
      auVar164 = vpternlogq_avx512vl(auVar143,auVar160,auVar164,0xea);
      auVar143 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0xe0);
      auVar166 = vpand_avx2(auVar143,local_480);
      auVar166 = vpsllw_avx2(auVar166,2);
      auVar125 = vpternlogq_avx512vl(auVar166,auVar160,auVar125,0xea);
      auVar85._8_8_ = uStack_458;
      auVar85._0_8_ = local_460;
      auVar85._16_8_ = uStack_450;
      auVar85._24_8_ = uStack_448;
      auVar166 = vpand_avx2(auVar143,auVar85);
      auVar166 = vpaddw_avx2(auVar166,auVar166);
      auVar127 = vpternlogq_avx512vl(auVar166,auVar160,auVar127,0xea);
      auVar90._8_8_ = uStack_438;
      auVar90._0_8_ = local_440;
      auVar90._16_8_ = uStack_430;
      auVar90._24_8_ = uStack_428;
      auVar166 = vpand_avx2(auVar143,auVar90);
      auVar95._8_8_ = uStack_418;
      auVar95._0_8_ = local_420;
      auVar95._16_8_ = uStack_410;
      auVar95._24_8_ = uStack_408;
      auVar143 = vpand_avx2(auVar143,auVar95);
      auVar118 = vpternlogq_avx512vl(auVar166,auVar160,auVar118,0xea);
      auVar143 = vpsrlw_avx2(auVar143,1);
      auVar152._8_8_ = 0x4000400040004000;
      auVar152._0_8_ = 0x4000400040004000;
      auVar152._16_8_ = 0x4000400040004000;
      auVar152._24_8_ = 0x4000400040004000;
      auVar133 = vpternlogq_avx512vl(auVar143,auVar152,auVar133,0xea);
      auVar143 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0xf0);
      auVar81._8_8_ = local_600._8_8_;
      auVar81._0_8_ = local_600._0_8_;
      auVar81._16_8_ = local_600._16_8_;
      auVar81._24_8_ = local_600._24_8_;
      auVar166 = vpand_avx2(auVar143,auVar81);
      auVar166 = vpsllw_avx2(auVar166,0xf);
      local_8c0._0_32_ = vpor_avx2(auVar166,auVar124);
      auVar166 = vpand_avx2(auVar143,local_5e0);
      auVar166 = vpsllw_avx2(auVar166,0xe);
      local_8c0._32_32_ = vpternlogq_avx512vl(auVar166,auVar168,auVar134,0xea);
      auVar166 = vpand_avx2(auVar143,local_5c0);
      auVar166 = vpsllw_avx2(auVar166,0xd);
      local_880._0_32_ = vpternlogq_avx512vl(auVar166,auVar168,auVar135,0xea);
      auVar166 = vpand_avx2(auVar143,local_5a0);
      auVar166 = vpsllw_avx2(auVar166,0xc);
      local_880._32_32_ = vpternlogq_avx512vl(auVar166,auVar168,auVar137,0xea);
      auVar166 = vpand_avx2(auVar143,local_580);
      auVar166 = vpsllw_avx2(auVar166,0xb);
      local_840._0_32_ = vpternlogq_avx512vl(auVar166,auVar168,auVar138,0xea);
      auVar166 = vpand_avx2(auVar143,local_560);
      auVar166 = vpsllw_avx2(auVar166,10);
      local_840._32_32_ = vpternlogq_avx512vl(auVar166,auVar168,auVar139,0xea);
      auVar166 = vpand_avx2(local_540,auVar143);
      auVar166 = vpsllw_avx2(auVar166,9);
      local_800._0_32_ = vpternlogq_avx512vl(auVar166,auVar168,auVar140,0xea);
      auVar166 = vpand_avx2(local_520,auVar143);
      auVar166 = vpsllw_avx2(auVar166,8);
      local_800._32_32_ = vpternlogq_avx512vl(auVar166,auVar168,auVar130,0xea);
      auVar166 = vpand_avx2(local_500,auVar143);
      auVar166 = vpsllw_avx2(auVar166,7);
      local_7c0._0_32_ = vpternlogq_avx512vl(auVar166,auVar168,auVar126,0xea);
      auVar166 = vpand_avx2(local_4e0,auVar143);
      auVar166 = vpsllw_avx2(auVar166,6);
      local_7c0._32_32_ = vpternlogq_avx512vl(auVar166,auVar168,auVar131,0xea);
      auVar166 = vpand_avx2(local_4c0,auVar143);
      auVar166 = vpsllw_avx2(auVar166,5);
      local_780._0_32_ = vpternlogq_avx512vl(auVar166,auVar168,auVar132,0xea);
      auVar143 = vpand_avx2(local_4a0,auVar143);
      auVar143 = vpsllw_avx2(auVar143,4);
      local_780._32_32_ = vpternlogq_avx512vl(auVar143,auVar168,auVar164,0xea);
      auVar143 = *(undefined1 (*) [32])(data + lVar103 * 0x10 + 0xf0);
      lVar105 = 0;
      auVar166 = vpandq_avx512vl(auVar108,auVar143);
      auVar166 = vpsllw_avx2(auVar166,3);
      local_740._0_32_ = vpternlogq_avx512vl(auVar166,auVar168,auVar125,0xea);
      auVar86._8_8_ = uStack_458;
      auVar86._0_8_ = local_460;
      auVar86._16_8_ = uStack_450;
      auVar86._24_8_ = uStack_448;
      auVar166 = vpand_avx2(auVar143,auVar86);
      auVar166 = vpsllw_avx2(auVar166,2);
      local_740._32_32_ = vpternlogq_avx512vl(auVar166,auVar168,auVar127,0xea);
      auVar91._8_8_ = uStack_438;
      auVar91._0_8_ = local_440;
      auVar91._16_8_ = uStack_430;
      auVar91._24_8_ = uStack_428;
      auVar166 = vpand_avx2(auVar143,auVar91);
      auVar96._8_8_ = uStack_418;
      auVar96._0_8_ = local_420;
      auVar96._16_8_ = uStack_410;
      auVar96._24_8_ = uStack_408;
      auVar124 = vpand_avx2(auVar143,auVar96);
      auVar143 = vpaddw_avx2(auVar166,auVar166);
      local_700._0_32_ = vpternlogq_avx512vl(auVar143,auVar168,auVar118,0xea);
      local_700._32_32_ = vpternlogq_avx512vl(auVar124,auVar168,auVar133,0xea);
      do {
        auVar143 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [32])(local_8c0 + lVar105 * 8));
        lVar1 = lVar105 * 8;
        *(undefined8 *)(local_8c0 + lVar1) = 0;
        *(undefined8 *)(local_8c0 + lVar1 + 8) = 0;
        *(undefined8 *)(local_8c0 + lVar1 + 0x10) = 0;
        *(undefined8 *)(local_8c0 + lVar1 + 0x18) = 0;
        auVar106 = vpmovqb_avx512vl(auVar143);
        auVar106 = vpsadbw_avx((undefined1  [16])0x0,ZEXT416(auVar106._0_4_));
        *(int *)(local_340[0] + lVar105) = *(int *)(local_340[0] + lVar105) + auVar106._0_4_;
        lVar105 = lVar105 + 4;
      } while (lVar105 != 0x40);
      lVar103 = lVar103 + 0x10;
      uVar104 = uVar104 + 1;
    } while (uVar104 != len >> 8);
    uVar102 = (int)lVar103 << 4;
  }
  if (uVar102 < len) {
    auVar147 = vmovdqa64_avx512f(local_340[0]);
    auVar144 = vpmovsxbd_avx512f(_DAT_0011f080);
    auVar145 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar104 = (ulong)uVar102;
    do {
      uVar104 = uVar104 + 1;
      auVar146 = vpbroadcastd_avx512f();
      auVar146 = vpsrlvd_avx512f(auVar146,auVar144);
      auVar146 = vpandd_avx512f(auVar146,auVar145);
      auVar147 = vpaddd_avx512f(auVar146,auVar147);
    } while (len != uVar104);
    local_340[0] = vmovdqa64_avx512f(auVar147);
  }
  *(undefined8 *)flags = local_340[0]._0_8_;
  *(undefined8 *)(flags + 2) = local_340[0]._8_8_;
  *(undefined8 *)(flags + 4) = local_340[0]._16_8_;
  *(undefined8 *)(flags + 6) = local_340[0]._24_8_;
  *(undefined8 *)(flags + 8) = local_340[0]._32_8_;
  *(undefined8 *)(flags + 10) = local_340[0]._40_8_;
  *(undefined8 *)(flags + 0xc) = local_340[0]._48_8_;
  *(undefined8 *)(flags + 0xe) = local_340[0]._56_8_;
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_popcnt(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m256i masks[16];
    __m256i stubs[16];
    for (int i = 0; i < 16; ++i) {
        masks[i] = _mm256_set1_epi16(1 << i);
        stubs[i] = _mm256_set1_epi16(0);
    }

    uint32_t out_counters[16] = {0};

    const __m256i* data_vectors = (const __m256i*)(data);
    const uint32_t n_cycles = len / 16;
    const uint32_t n_cycles_updates = n_cycles / 16;

#define UPDATE(idx, shift) stubs[idx] = _mm256_or_si256(stubs[idx], _mm256_slli_epi16(_mm256_srli_epi16(_mm256_and_si256(_mm256_loadu_si256(data_vectors+pos), masks[idx]),  idx), shift));
#define ITERATION(idx) {                                           \
    UPDATE(0,idx);  UPDATE(1,idx);  UPDATE(2,idx);  UPDATE(3,idx); \
    UPDATE(4,idx);  UPDATE(5,idx);  UPDATE(6,idx);  UPDATE(7,idx); \
    UPDATE(8,idx);  UPDATE(9,idx);  UPDATE(10,idx); UPDATE(11,idx);\
    UPDATE(12,idx); UPDATE(13,idx); UPDATE(14,idx); UPDATE(15,idx);\
    ++pos;                                                         \
}
#define BLOCK {                                                \
    ITERATION(0);  ITERATION(1);  ITERATION(2);  ITERATION(3); \
    ITERATION(4);  ITERATION(5);  ITERATION(6);  ITERATION(7); \
    ITERATION(8);  ITERATION(9);  ITERATION(10); ITERATION(11);\
    ITERATION(12); ITERATION(13); ITERATION(14); ITERATION(15);\
}

    uint32_t pos = 0;
    for (size_t i = 0; i < n_cycles_updates; ++i) {
        BLOCK // unrolled
        
        // Not unrolled
        /*
        for (int c = 0; c < 16; ++c) { // 16 iterations per register
            ITERATION(c)
            // for (int j = 0; j < 16; ++j) { // each 1-hot per register
            //     UPDATE(j,c)
            // }
        }
        */

        for (int j = 0; j < 16; ++j) {
            PIL_POPCOUNT_AVX2(out_counters[j], stubs[j])
            stubs[j] = _mm256_set1_epi16(0);
        }
    }

    // residual
    for (size_t i = pos*16; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            out_counters[j] += ((data[i] & (1 << j)) >> j);
        }
    }

    for (int i = 0; i < 16; ++i)
        flags[i] = out_counters[i];

#undef BLOCK
#undef ITERATION
#undef UPDATE

    return 0;
}